

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::avx512::CurveNiMBIntersectorK<4,8>::
     occluded_n<embree::avx512::OrientedCurve1IntersectorK<embree::BezierCurveT,8>,embree::avx512::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  long lVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  Primitive PVar5;
  uint uVar6;
  Geometry *pGVar7;
  __int_type_conflict _Var8;
  long lVar9;
  long lVar10;
  long lVar11;
  RTCFilterFunctionN p_Var12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  bool bVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  byte bVar30;
  uint uVar31;
  ulong uVar32;
  uint uVar34;
  ulong uVar35;
  long lVar36;
  uint uVar37;
  long lVar38;
  uint uVar39;
  bool bVar40;
  bool bVar41;
  ulong uVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar94 [32];
  undefined1 auVar96 [32];
  undefined1 auVar98 [32];
  undefined1 auVar100 [32];
  int iVar102;
  float fVar103;
  undefined4 uVar104;
  float fVar108;
  vint4 bi_2;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  vint4 bi_1;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [32];
  vint4 bi;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [32];
  float fVar129;
  float fVar146;
  float fVar147;
  float fVar148;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  vint4 ai_2;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  vint4 ai_1;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [32];
  float fVar187;
  vint4 ai;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [32];
  float fVar201;
  float fVar202;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  float fVar203;
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  __m128 a;
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar219 [16];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  float fVar225;
  float fVar226;
  float fVar236;
  float fVar238;
  vfloat4 a0_2;
  undefined1 auVar227 [16];
  float fVar237;
  float fVar239;
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  float fVar240;
  float fVar241;
  float fVar242;
  vfloat4 a0_3;
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  vfloat4 b0_2;
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  vfloat4 b0_3;
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [64];
  undefined1 in_ZMM17 [64];
  undefined1 in_ZMM18 [64];
  undefined1 in_ZMM22 [64];
  undefined1 auVar277 [64];
  undefined1 auVar278 [64];
  undefined1 auVar279 [64];
  undefined1 auVar280 [64];
  int iVar281;
  undefined1 in_ZMM31 [64];
  undefined1 auVar282 [64];
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  bool local_5a5;
  float local_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  uint auStack_440 [4];
  RTCFilterFunctionNArguments local_430;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [8];
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  undefined1 local_370 [8];
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  undefined1 local_350 [16];
  undefined1 local_340 [16];
  undefined1 local_330 [16];
  undefined1 local_320 [16];
  undefined1 local_310 [16];
  undefined1 local_300 [16];
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [16];
  undefined1 local_290 [16];
  undefined1 local_280 [16];
  undefined1 local_270 [16];
  uint uStack_260;
  float afStack_25c [7];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  RTCHitN local_180 [32];
  undefined1 local_160 [32];
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar33;
  undefined1 auVar93 [32];
  undefined1 auVar95 [32];
  undefined1 auVar97 [32];
  undefined1 auVar99 [32];
  undefined1 auVar101 [32];
  float fVar130;
  undefined1 auVar263 [32];
  
  PVar5 = prim[1];
  uVar32 = (ulong)(byte)PVar5;
  lVar36 = uVar32 * 0x25;
  fVar103 = *(float *)(prim + lVar36 + 0x12);
  auVar43 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar43 = vinsertps_avx(auVar43,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar44 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar44 = vinsertps_avx(auVar44,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar43 = vsubps_avx(auVar43,*(undefined1 (*) [16])(prim + lVar36 + 6));
  auVar65._0_4_ = fVar103 * auVar43._0_4_;
  auVar65._4_4_ = fVar103 * auVar43._4_4_;
  auVar65._8_4_ = fVar103 * auVar43._8_4_;
  auVar65._12_4_ = fVar103 * auVar43._12_4_;
  auVar43 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar32 * 4 + 6)));
  auVar46._0_4_ = fVar103 * auVar44._0_4_;
  auVar46._4_4_ = fVar103 * auVar44._4_4_;
  auVar46._8_4_ = fVar103 * auVar44._8_4_;
  auVar46._12_4_ = fVar103 * auVar44._12_4_;
  auVar43 = vcvtdq2ps_avx(auVar43);
  auVar44 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar32 * 5 + 6)));
  auVar44 = vcvtdq2ps_avx(auVar44);
  auVar52 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar32 * 6 + 6)));
  auVar51 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar32 * 0xf + 6)));
  auVar52 = vcvtdq2ps_avx(auVar52);
  auVar51 = vcvtdq2ps_avx(auVar51);
  auVar58 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar5 * 0x10 + 6)));
  auVar58 = vcvtdq2ps_avx(auVar58);
  auVar55 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar5 * 0x10 + uVar32 + 6)));
  auVar55 = vcvtdq2ps_avx(auVar55);
  auVar56 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar32 * 0x1a + 6)));
  auVar56 = vcvtdq2ps_avx(auVar56);
  auVar57 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar32 * 0x1b + 6)));
  auVar57 = vcvtdq2ps_avx(auVar57);
  auVar59 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar32 * 0x1c + 6)));
  auVar59 = vcvtdq2ps_avx(auVar59);
  auVar69._4_4_ = auVar46._0_4_;
  auVar69._0_4_ = auVar46._0_4_;
  auVar69._8_4_ = auVar46._0_4_;
  auVar69._12_4_ = auVar46._0_4_;
  auVar60 = vshufps_avx(auVar46,auVar46,0x55);
  auVar61 = vshufps_avx(auVar46,auVar46,0xaa);
  fVar103 = auVar61._0_4_;
  auVar67._0_4_ = fVar103 * auVar52._0_4_;
  fVar108 = auVar61._4_4_;
  auVar67._4_4_ = fVar108 * auVar52._4_4_;
  fVar242 = auVar61._8_4_;
  auVar67._8_4_ = fVar242 * auVar52._8_4_;
  fVar226 = auVar61._12_4_;
  auVar67._12_4_ = fVar226 * auVar52._12_4_;
  auVar54._0_4_ = auVar55._0_4_ * fVar103;
  auVar54._4_4_ = auVar55._4_4_ * fVar108;
  auVar54._8_4_ = auVar55._8_4_ * fVar242;
  auVar54._12_4_ = auVar55._12_4_ * fVar226;
  auVar47._0_4_ = auVar59._0_4_ * fVar103;
  auVar47._4_4_ = auVar59._4_4_ * fVar108;
  auVar47._8_4_ = auVar59._8_4_ * fVar242;
  auVar47._12_4_ = auVar59._12_4_ * fVar226;
  auVar61 = vfmadd231ps_fma(auVar67,auVar60,auVar44);
  auVar62 = vfmadd231ps_fma(auVar54,auVar60,auVar58);
  auVar60 = vfmadd231ps_fma(auVar47,auVar57,auVar60);
  auVar63 = vfmadd231ps_fma(auVar61,auVar69,auVar43);
  auVar62 = vfmadd231ps_fma(auVar62,auVar69,auVar51);
  auVar64 = vfmadd231ps_fma(auVar60,auVar56,auVar69);
  auVar264._4_4_ = auVar65._0_4_;
  auVar264._0_4_ = auVar65._0_4_;
  auVar264._8_4_ = auVar65._0_4_;
  auVar264._12_4_ = auVar65._0_4_;
  auVar60 = vshufps_avx(auVar65,auVar65,0x55);
  auVar61 = vshufps_avx(auVar65,auVar65,0xaa);
  fVar103 = auVar61._0_4_;
  auVar159._0_4_ = fVar103 * auVar52._0_4_;
  fVar108 = auVar61._4_4_;
  auVar159._4_4_ = fVar108 * auVar52._4_4_;
  fVar242 = auVar61._8_4_;
  auVar159._8_4_ = fVar242 * auVar52._8_4_;
  fVar226 = auVar61._12_4_;
  auVar159._12_4_ = fVar226 * auVar52._12_4_;
  auVar149._0_4_ = auVar55._0_4_ * fVar103;
  auVar149._4_4_ = auVar55._4_4_ * fVar108;
  auVar149._8_4_ = auVar55._8_4_ * fVar242;
  auVar149._12_4_ = auVar55._12_4_ * fVar226;
  auVar66._0_4_ = auVar59._0_4_ * fVar103;
  auVar66._4_4_ = auVar59._4_4_ * fVar108;
  auVar66._8_4_ = auVar59._8_4_ * fVar242;
  auVar66._12_4_ = auVar59._12_4_ * fVar226;
  auVar44 = vfmadd231ps_fma(auVar159,auVar60,auVar44);
  auVar52 = vfmadd231ps_fma(auVar149,auVar60,auVar58);
  auVar58 = vfmadd231ps_fma(auVar66,auVar60,auVar57);
  auVar45 = vfmadd231ps_fma(auVar44,auVar264,auVar43);
  auVar46 = vfmadd231ps_fma(auVar52,auVar264,auVar51);
  auVar43 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar278 = ZEXT1664(auVar43);
  auVar47 = vfmadd231ps_fma(auVar58,auVar264,auVar56);
  auVar44 = vandps_avx512vl(auVar63,auVar43);
  auVar188._8_4_ = 0x219392ef;
  auVar188._0_8_ = 0x219392ef219392ef;
  auVar188._12_4_ = 0x219392ef;
  uVar42 = vcmpps_avx512vl(auVar44,auVar188,1);
  bVar40 = (bool)((byte)uVar42 & 1);
  auVar48._0_4_ = (uint)bVar40 * 0x219392ef | (uint)!bVar40 * auVar63._0_4_;
  bVar40 = (bool)((byte)(uVar42 >> 1) & 1);
  auVar48._4_4_ = (uint)bVar40 * 0x219392ef | (uint)!bVar40 * auVar63._4_4_;
  bVar40 = (bool)((byte)(uVar42 >> 2) & 1);
  auVar48._8_4_ = (uint)bVar40 * 0x219392ef | (uint)!bVar40 * auVar63._8_4_;
  bVar40 = (bool)((byte)(uVar42 >> 3) & 1);
  auVar48._12_4_ = (uint)bVar40 * 0x219392ef | (uint)!bVar40 * auVar63._12_4_;
  auVar44 = vandps_avx512vl(auVar62,auVar43);
  uVar42 = vcmpps_avx512vl(auVar44,auVar188,1);
  bVar40 = (bool)((byte)uVar42 & 1);
  auVar49._0_4_ = (uint)bVar40 * 0x219392ef | (uint)!bVar40 * auVar62._0_4_;
  bVar40 = (bool)((byte)(uVar42 >> 1) & 1);
  auVar49._4_4_ = (uint)bVar40 * 0x219392ef | (uint)!bVar40 * auVar62._4_4_;
  bVar40 = (bool)((byte)(uVar42 >> 2) & 1);
  auVar49._8_4_ = (uint)bVar40 * 0x219392ef | (uint)!bVar40 * auVar62._8_4_;
  bVar40 = (bool)((byte)(uVar42 >> 3) & 1);
  auVar49._12_4_ = (uint)bVar40 * 0x219392ef | (uint)!bVar40 * auVar62._12_4_;
  auVar43 = vandps_avx512vl(auVar64,auVar43);
  uVar42 = vcmpps_avx512vl(auVar43,auVar188,1);
  bVar40 = (bool)((byte)uVar42 & 1);
  auVar50._0_4_ = (uint)bVar40 * 0x219392ef | (uint)!bVar40 * auVar64._0_4_;
  bVar40 = (bool)((byte)(uVar42 >> 1) & 1);
  auVar50._4_4_ = (uint)bVar40 * 0x219392ef | (uint)!bVar40 * auVar64._4_4_;
  bVar40 = (bool)((byte)(uVar42 >> 2) & 1);
  auVar50._8_4_ = (uint)bVar40 * 0x219392ef | (uint)!bVar40 * auVar64._8_4_;
  bVar40 = (bool)((byte)(uVar42 >> 3) & 1);
  auVar50._12_4_ = (uint)bVar40 * 0x219392ef | (uint)!bVar40 * auVar64._12_4_;
  auVar44 = vrcp14ps_avx512vl(auVar48);
  auVar189._8_4_ = 0x3f800000;
  auVar189._0_8_ = &DAT_3f8000003f800000;
  auVar189._12_4_ = 0x3f800000;
  auVar43 = vfnmadd213ps_fma(auVar48,auVar44,auVar189);
  auVar63 = vfmadd132ps_fma(auVar43,auVar44,auVar44);
  auVar44 = vrcp14ps_avx512vl(auVar49);
  auVar43 = vfnmadd213ps_fma(auVar49,auVar44,auVar189);
  auVar64 = vfmadd132ps_fma(auVar43,auVar44,auVar44);
  auVar44 = vrcp14ps_avx512vl(auVar50);
  auVar43 = vfnmadd213ps_fma(auVar50,auVar44,auVar189);
  auVar23 = vfmadd132ps_fma(auVar43,auVar44,auVar44);
  fVar103 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar36 + 0x16)) *
            *(float *)(prim + lVar36 + 0x1a);
  auVar176._4_4_ = fVar103;
  auVar176._0_4_ = fVar103;
  auVar176._8_4_ = fVar103;
  auVar176._12_4_ = fVar103;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = *(ulong *)(prim + uVar32 * 7 + 6);
  auVar43 = vpmovsxwd_avx(auVar43);
  auVar43 = vcvtdq2ps_avx(auVar43);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = *(ulong *)(prim + uVar32 * 0xb + 6);
  auVar44 = vpmovsxwd_avx(auVar44);
  auVar44 = vcvtdq2ps_avx(auVar44);
  auVar51 = vsubps_avx(auVar44,auVar43);
  auVar52._8_8_ = 0;
  auVar52._0_8_ = *(ulong *)(prim + uVar32 * 9 + 6);
  auVar44 = vpmovsxwd_avx(auVar52);
  auVar52 = vfmadd213ps_fma(auVar51,auVar176,auVar43);
  auVar43 = vcvtdq2ps_avx(auVar44);
  auVar51._8_8_ = 0;
  auVar51._0_8_ = *(ulong *)(prim + uVar32 * 0xd + 6);
  auVar44 = vpmovsxwd_avx(auVar51);
  auVar44 = vcvtdq2ps_avx(auVar44);
  auVar44 = vsubps_avx(auVar44,auVar43);
  auVar51 = vfmadd213ps_fma(auVar44,auVar176,auVar43);
  auVar58._8_8_ = 0;
  auVar58._0_8_ = *(ulong *)(prim + uVar32 * 0x12 + 6);
  auVar43 = vpmovsxwd_avx(auVar58);
  auVar43 = vcvtdq2ps_avx(auVar43);
  uVar42 = (ulong)(uint)((int)(uVar32 * 5) << 2);
  auVar55._8_8_ = 0;
  auVar55._0_8_ = *(ulong *)(prim + uVar32 * 2 + uVar42 + 6);
  auVar44 = vpmovsxwd_avx(auVar55);
  auVar44 = vcvtdq2ps_avx(auVar44);
  auVar44 = vsubps_avx(auVar44,auVar43);
  auVar58 = vfmadd213ps_fma(auVar44,auVar176,auVar43);
  auVar56._8_8_ = 0;
  auVar56._0_8_ = *(ulong *)(prim + uVar42 + 6);
  auVar43 = vpmovsxwd_avx(auVar56);
  auVar43 = vcvtdq2ps_avx(auVar43);
  auVar57._8_8_ = 0;
  auVar57._0_8_ = *(ulong *)(prim + uVar32 * 0x18 + 6);
  auVar44 = vpmovsxwd_avx(auVar57);
  auVar44 = vcvtdq2ps_avx(auVar44);
  auVar44 = vsubps_avx(auVar44,auVar43);
  auVar55 = vfmadd213ps_fma(auVar44,auVar176,auVar43);
  auVar59._8_8_ = 0;
  auVar59._0_8_ = *(ulong *)(prim + uVar32 * 0x1d + 6);
  auVar43 = vpmovsxwd_avx(auVar59);
  auVar43 = vcvtdq2ps_avx(auVar43);
  auVar60._8_8_ = 0;
  auVar60._0_8_ = *(ulong *)(prim + uVar32 + (ulong)(byte)PVar5 * 0x20 + 6);
  auVar44 = vpmovsxwd_avx(auVar60);
  auVar44 = vcvtdq2ps_avx(auVar44);
  auVar44 = vsubps_avx(auVar44,auVar43);
  auVar56 = vfmadd213ps_fma(auVar44,auVar176,auVar43);
  auVar61._8_8_ = 0;
  auVar61._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar5 * 0x20 - uVar32) + 6);
  auVar43 = vpmovsxwd_avx(auVar61);
  auVar43 = vcvtdq2ps_avx(auVar43);
  auVar62._8_8_ = 0;
  auVar62._0_8_ = *(ulong *)(prim + uVar32 * 0x23 + 6);
  auVar44 = vpmovsxwd_avx(auVar62);
  auVar44 = vcvtdq2ps_avx(auVar44);
  auVar44 = vsubps_avx(auVar44,auVar43);
  auVar44 = vfmadd213ps_fma(auVar44,auVar176,auVar43);
  auVar43 = vsubps_avx(auVar52,auVar45);
  auVar177._0_4_ = auVar63._0_4_ * auVar43._0_4_;
  auVar177._4_4_ = auVar63._4_4_ * auVar43._4_4_;
  auVar177._8_4_ = auVar63._8_4_ * auVar43._8_4_;
  auVar177._12_4_ = auVar63._12_4_ * auVar43._12_4_;
  auVar43 = vsubps_avx(auVar51,auVar45);
  auVar68._0_4_ = auVar63._0_4_ * auVar43._0_4_;
  auVar68._4_4_ = auVar63._4_4_ * auVar43._4_4_;
  auVar68._8_4_ = auVar63._8_4_ * auVar43._8_4_;
  auVar68._12_4_ = auVar63._12_4_ * auVar43._12_4_;
  auVar43 = vsubps_avx(auVar58,auVar46);
  auVar160._0_4_ = auVar64._0_4_ * auVar43._0_4_;
  auVar160._4_4_ = auVar64._4_4_ * auVar43._4_4_;
  auVar160._8_4_ = auVar64._8_4_ * auVar43._8_4_;
  auVar160._12_4_ = auVar64._12_4_ * auVar43._12_4_;
  auVar43 = vsubps_avx(auVar55,auVar46);
  auVar109._0_4_ = auVar64._0_4_ * auVar43._0_4_;
  auVar109._4_4_ = auVar64._4_4_ * auVar43._4_4_;
  auVar109._8_4_ = auVar64._8_4_ * auVar43._8_4_;
  auVar109._12_4_ = auVar64._12_4_ * auVar43._12_4_;
  auVar43 = vsubps_avx(auVar56,auVar47);
  auVar150._0_4_ = auVar23._0_4_ * auVar43._0_4_;
  auVar150._4_4_ = auVar23._4_4_ * auVar43._4_4_;
  auVar150._8_4_ = auVar23._8_4_ * auVar43._8_4_;
  auVar150._12_4_ = auVar23._12_4_ * auVar43._12_4_;
  auVar43 = vsubps_avx(auVar44,auVar47);
  auVar53._0_4_ = auVar23._0_4_ * auVar43._0_4_;
  auVar53._4_4_ = auVar23._4_4_ * auVar43._4_4_;
  auVar53._8_4_ = auVar23._8_4_ * auVar43._8_4_;
  auVar53._12_4_ = auVar23._12_4_ * auVar43._12_4_;
  auVar43 = vpminsd_avx(auVar177,auVar68);
  auVar44 = vpminsd_avx(auVar160,auVar109);
  auVar43 = vmaxps_avx(auVar43,auVar44);
  auVar44 = vpminsd_avx(auVar150,auVar53);
  uVar104 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar63._4_4_ = uVar104;
  auVar63._0_4_ = uVar104;
  auVar63._8_4_ = uVar104;
  auVar63._12_4_ = uVar104;
  auVar44 = vmaxps_avx512vl(auVar44,auVar63);
  auVar43 = vmaxps_avx(auVar43,auVar44);
  auVar64._8_4_ = 0x3f7ffffa;
  auVar64._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar64._12_4_ = 0x3f7ffffa;
  local_3a0 = vmulps_avx512vl(auVar43,auVar64);
  auVar43 = vpmaxsd_avx(auVar177,auVar68);
  auVar44 = vpmaxsd_avx(auVar160,auVar109);
  auVar43 = vminps_avx(auVar43,auVar44);
  auVar44 = vpmaxsd_avx(auVar150,auVar53);
  uVar104 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar23._4_4_ = uVar104;
  auVar23._0_4_ = uVar104;
  auVar23._8_4_ = uVar104;
  auVar23._12_4_ = uVar104;
  auVar44 = vminps_avx512vl(auVar44,auVar23);
  auVar43 = vminps_avx(auVar43,auVar44);
  auVar45._8_4_ = 0x3f800003;
  auVar45._0_8_ = 0x3f8000033f800003;
  auVar45._12_4_ = 0x3f800003;
  auVar43 = vmulps_avx512vl(auVar43,auVar45);
  auVar44 = vpbroadcastd_avx512vl();
  uVar20 = vcmpps_avx512vl(local_3a0,auVar43,2);
  uVar42 = vpcmpgtd_avx512vl(auVar44,_DAT_01ff0cf0);
  uVar42 = ((byte)uVar20 & 0xf) & uVar42;
  bVar40 = (char)uVar42 == '\0';
  local_5a5 = !bVar40;
  if (bVar40) {
    return local_5a5;
  }
  local_240 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar43 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
  auVar282 = ZEXT1664(auVar43);
  auVar43 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar277 = ZEXT1664(auVar43);
LAB_01c26b03:
  lVar36 = 0;
  for (uVar32 = uVar42; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x8000000000000000) {
    lVar36 = lVar36 + 1;
  }
  uVar39 = *(uint *)(prim + 2);
  pGVar7 = (context->scene->geometries).items[uVar39].ptr;
  fVar103 = (pGVar7->time_range).lower;
  fVar103 = pGVar7->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0xe0) - fVar103) / ((pGVar7->time_range).upper - fVar103));
  auVar43 = vroundss_avx(ZEXT416((uint)fVar103),ZEXT416((uint)fVar103),9);
  auVar43 = vminss_avx(auVar43,ZEXT416((uint)(pGVar7->fnumTimeSegments + -1.0)));
  auVar45 = vmaxss_avx512f(auVar282._0_16_,auVar43);
  uVar32 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                           (ulong)*(uint *)(prim + lVar36 * 4 + 6) *
                           pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var8 = pGVar7[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar38 = (long)(int)auVar45._0_4_ * 0x38;
  lVar9 = *(long *)(_Var8 + lVar38);
  lVar10 = *(long *)(_Var8 + 0x10 + lVar38);
  auVar43 = *(undefined1 (*) [16])(lVar9 + lVar10 * uVar32);
  lVar36 = uVar32 + 1;
  auVar44 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar36);
  lVar1 = uVar32 + 2;
  auVar52 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar1);
  lVar2 = uVar32 + 3;
  auVar51 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar2);
  lVar9 = *(long *)&pGVar7[4].fnumTimeSegments;
  lVar10 = *(long *)(lVar9 + lVar38);
  lVar11 = *(long *)(lVar9 + 0x10 + lVar38);
  auVar58 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar32);
  auVar55 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar36);
  auVar56 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
  auVar57 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar2);
  lVar10 = *(long *)(_Var8 + 0x38 + lVar38);
  lVar11 = *(long *)(_Var8 + 0x48 + lVar38);
  auVar59 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar32);
  auVar60 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar36);
  auVar61 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
  auVar62 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar2);
  local_200 = vpbroadcastd_avx512vl();
  lVar10 = *(long *)(lVar9 + 0x38 + lVar38);
  lVar9 = *(long *)(lVar9 + 0x48 + lVar38);
  auVar63 = *(undefined1 (*) [16])(lVar10 + uVar32 * lVar9);
  auVar64 = *(undefined1 (*) [16])(lVar10 + lVar36 * lVar9);
  auVar23 = *(undefined1 (*) [16])(lVar10 + lVar1 * lVar9);
  auVar88._16_16_ = local_200._16_16_;
  auVar45 = vsubss_avx512f(ZEXT416((uint)fVar103),auVar45);
  auVar88._0_16_ = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
  auVar46 = vmulps_avx512vl(auVar51,auVar88._0_16_);
  auVar46 = vfmadd231ps_avx512vl(auVar46,auVar52,auVar88._0_16_);
  auVar47 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
  auVar47 = vfmadd213ps_avx512vl(auVar47,auVar44,auVar46);
  auVar47 = vaddps_avx512vl(auVar43,auVar47);
  auVar109 = auVar277._0_16_;
  auVar46 = vfmadd231ps_avx512vl(auVar46,auVar44,auVar109);
  auVar46 = vfnmadd231ps_avx512vl(auVar46,auVar43,auVar109);
  auVar48 = vmulps_avx512vl(auVar57,auVar88._0_16_);
  auVar48 = vfmadd231ps_avx512vl(auVar48,auVar56,auVar88._0_16_);
  auVar49 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
  auVar49 = vfmadd213ps_avx512vl(auVar49,auVar55,auVar48);
  auVar50 = vaddps_avx512vl(auVar58,auVar49);
  auVar48 = vfmadd231ps_avx512vl(auVar48,auVar55,auVar109);
  auVar48 = vfnmadd231ps_avx512vl(auVar48,auVar58,auVar109);
  auVar49 = vxorps_avx512vl(auVar49,auVar49);
  auVar49 = vfmadd213ps_avx512vl(auVar49,auVar52,auVar51);
  auVar49 = vfmadd231ps_avx512vl(auVar49,auVar44,auVar88._0_16_);
  auVar49 = vfmadd231ps_avx512vl(auVar49,auVar43,auVar88._0_16_);
  auVar51 = vmulps_avx512vl(auVar51,auVar109);
  auVar52 = vfnmadd231ps_avx512vl(auVar51,auVar109,auVar52);
  auVar44 = vfmadd231ps_avx512vl(auVar52,auVar88._0_16_,auVar44);
  auVar53 = vfnmadd231ps_avx512vl(auVar44,auVar88._0_16_,auVar43);
  auVar43 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar56,auVar57);
  auVar43 = vfmadd231ps_avx512vl(auVar43,auVar55,auVar88._0_16_);
  auVar54 = vfmadd231ps_avx512vl(auVar43,auVar58,auVar88._0_16_);
  auVar43 = vmulps_avx512vl(auVar57,auVar109);
  auVar43 = vfnmadd231ps_avx512vl(auVar43,auVar109,auVar56);
  auVar43 = vfmadd231ps_avx512vl(auVar43,auVar88._0_16_,auVar55);
  auVar55 = vfnmadd231ps_avx512vl(auVar43,auVar88._0_16_,auVar58);
  auVar43 = vshufps_avx(auVar46,auVar46,0xc9);
  auVar44 = vshufps_avx512vl(auVar50,auVar50,0xc9);
  fVar129 = auVar46._0_4_;
  auVar161._0_4_ = fVar129 * auVar44._0_4_;
  fVar146 = auVar46._4_4_;
  auVar161._4_4_ = fVar146 * auVar44._4_4_;
  fVar147 = auVar46._8_4_;
  auVar161._8_4_ = fVar147 * auVar44._8_4_;
  fVar148 = auVar46._12_4_;
  auVar161._12_4_ = fVar148 * auVar44._12_4_;
  auVar44 = vfmsub231ps_avx512vl(auVar161,auVar43,auVar50);
  auVar52 = vshufps_avx(auVar44,auVar44,0xc9);
  auVar44 = vshufps_avx512vl(auVar48,auVar48,0xc9);
  auVar178._0_4_ = fVar129 * auVar44._0_4_;
  auVar178._4_4_ = fVar146 * auVar44._4_4_;
  auVar178._8_4_ = fVar147 * auVar44._8_4_;
  auVar178._12_4_ = fVar148 * auVar44._12_4_;
  auVar43 = vfmsub231ps_avx512vl(auVar178,auVar43,auVar48);
  auVar51 = vshufps_avx(auVar43,auVar43,0xc9);
  auVar43 = vshufps_avx(auVar53,auVar53,0xc9);
  auVar44 = vshufps_avx(auVar54,auVar54,0xc9);
  fVar103 = auVar53._0_4_;
  auVar204._0_4_ = auVar44._0_4_ * fVar103;
  fVar108 = auVar53._4_4_;
  auVar204._4_4_ = auVar44._4_4_ * fVar108;
  fVar242 = auVar53._8_4_;
  auVar204._8_4_ = auVar44._8_4_ * fVar242;
  fVar226 = auVar53._12_4_;
  auVar204._12_4_ = auVar44._12_4_ * fVar226;
  auVar44 = vfmsub231ps_fma(auVar204,auVar43,auVar54);
  auVar58 = vshufps_avx(auVar44,auVar44,0xc9);
  auVar44 = vshufps_avx(auVar55,auVar55,0xc9);
  auVar205._0_4_ = auVar44._0_4_ * fVar103;
  auVar205._4_4_ = auVar44._4_4_ * fVar108;
  auVar205._8_4_ = auVar44._8_4_ * fVar242;
  auVar205._12_4_ = auVar44._12_4_ * fVar226;
  auVar43 = vfmsub231ps_fma(auVar205,auVar43,auVar55);
  auVar55 = vshufps_avx(auVar43,auVar43,0xc9);
  auVar43 = vdpps_avx(auVar52,auVar52,0x7f);
  auVar84._4_28_ = auVar88._4_28_;
  auVar84._0_4_ = auVar43._0_4_;
  auVar44 = vrsqrt14ss_avx512f(auVar88._0_16_,auVar84._0_16_);
  auVar56 = vmulss_avx512f(auVar44,ZEXT416(0x3fc00000));
  auVar57 = vmulss_avx512f(auVar43,ZEXT416(0x3f000000));
  auVar57 = vmulss_avx512f(auVar57,auVar44);
  auVar44 = vmulss_avx512f(auVar57,ZEXT416((uint)(auVar44._0_4_ * auVar44._0_4_)));
  auVar44 = vsubss_avx512f(auVar56,auVar44);
  auVar215._0_4_ = auVar44._0_4_;
  auVar215._4_4_ = auVar215._0_4_;
  auVar215._8_4_ = auVar215._0_4_;
  auVar215._12_4_ = auVar215._0_4_;
  auVar56 = vmulps_avx512vl(auVar52,auVar215);
  auVar44 = vdpps_avx(auVar52,auVar51,0x7f);
  auVar57 = vbroadcastss_avx512vl(auVar43);
  auVar51 = vmulps_avx512vl(auVar57,auVar51);
  fVar237 = auVar44._0_4_;
  auVar162._0_4_ = fVar237 * auVar52._0_4_;
  auVar162._4_4_ = fVar237 * auVar52._4_4_;
  auVar162._8_4_ = fVar237 * auVar52._8_4_;
  auVar162._12_4_ = fVar237 * auVar52._12_4_;
  auVar52 = vsubps_avx(auVar51,auVar162);
  auVar44 = vrcp14ss_avx512f(auVar88._0_16_,auVar84._0_16_);
  auVar43 = vfnmadd213ss_avx512f(auVar43,auVar44,ZEXT416(0x40000000));
  fVar237 = auVar44._0_4_ * auVar43._0_4_;
  auVar43 = vdpps_avx(auVar58,auVar58,0x7f);
  auVar70._16_16_ = auVar88._16_16_;
  auVar70._0_16_ = auVar88._0_16_;
  auVar86._4_28_ = auVar70._4_28_;
  auVar86._0_4_ = auVar43._0_4_;
  auVar44 = vrsqrt14ss_avx512f(auVar88._0_16_,auVar86._0_16_);
  auVar51 = vmulss_avx512f(auVar44,ZEXT416(0x3fc00000));
  auVar57 = vmulss_avx512f(auVar43,ZEXT416(0x3f000000));
  fVar238 = auVar44._0_4_;
  fVar130 = auVar51._0_4_ - auVar57._0_4_ * fVar238 * fVar238 * fVar238;
  auVar216._0_4_ = fVar130 * auVar58._0_4_;
  auVar216._4_4_ = fVar130 * auVar58._4_4_;
  auVar216._8_4_ = fVar130 * auVar58._8_4_;
  auVar216._12_4_ = fVar130 * auVar58._12_4_;
  auVar44 = vdpps_avx(auVar58,auVar55,0x7f);
  auVar51 = vbroadcastss_avx512vl(auVar43);
  auVar51 = vmulps_avx512vl(auVar51,auVar55);
  fVar238 = auVar44._0_4_;
  auVar105._0_4_ = fVar238 * auVar58._0_4_;
  auVar105._4_4_ = fVar238 * auVar58._4_4_;
  auVar105._8_4_ = fVar238 * auVar58._8_4_;
  auVar105._12_4_ = fVar238 * auVar58._12_4_;
  auVar44 = vsubps_avx(auVar51,auVar105);
  auVar51 = vrcp14ss_avx512f(auVar88._0_16_,auVar86._0_16_);
  auVar43 = vfnmadd213ss_avx512f(auVar43,auVar51,ZEXT416(0x40000000));
  fVar238 = auVar51._0_4_ * auVar43._0_4_;
  auVar51 = vshufps_avx512vl(auVar47,auVar47,0xff);
  auVar58 = vmulps_avx512vl(auVar51,auVar56);
  auVar55 = vsubps_avx512vl(auVar47,auVar58);
  auVar43 = vshufps_avx(auVar46,auVar46,0xff);
  auVar43 = vmulps_avx512vl(auVar43,auVar56);
  auVar151._0_4_ = auVar43._0_4_ + auVar51._0_4_ * auVar215._0_4_ * fVar237 * auVar52._0_4_;
  auVar151._4_4_ = auVar43._4_4_ + auVar51._4_4_ * auVar215._0_4_ * fVar237 * auVar52._4_4_;
  auVar151._8_4_ = auVar43._8_4_ + auVar51._8_4_ * auVar215._0_4_ * fVar237 * auVar52._8_4_;
  auVar151._12_4_ = auVar43._12_4_ + auVar51._12_4_ * auVar215._0_4_ * fVar237 * auVar52._12_4_;
  auVar43 = vsubps_avx(auVar46,auVar151);
  auVar56 = vaddps_avx512vl(auVar47,auVar58);
  auVar52 = vshufps_avx512vl(auVar49,auVar49,0xff);
  auVar250._0_4_ = auVar216._0_4_ * auVar52._0_4_;
  auVar250._4_4_ = auVar216._4_4_ * auVar52._4_4_;
  auVar250._8_4_ = auVar216._8_4_ * auVar52._8_4_;
  auVar250._12_4_ = auVar216._12_4_ * auVar52._12_4_;
  auVar57 = vsubps_avx512vl(auVar49,auVar250);
  auVar51 = vshufps_avx512vl(auVar53,auVar53,0xff);
  auVar58 = vmulps_avx512vl(auVar51,auVar216);
  auVar163._0_4_ = auVar58._0_4_ + auVar52._0_4_ * fVar130 * auVar44._0_4_ * fVar238;
  auVar163._4_4_ = auVar58._4_4_ + auVar52._4_4_ * fVar130 * auVar44._4_4_ * fVar238;
  auVar163._8_4_ = auVar58._8_4_ + auVar52._8_4_ * fVar130 * auVar44._8_4_ * fVar238;
  auVar163._12_4_ = auVar58._12_4_ + auVar52._12_4_ * fVar130 * auVar44._12_4_ * fVar238;
  auVar44 = vsubps_avx(auVar53,auVar163);
  auVar46 = vaddps_avx512vl(auVar49,auVar250);
  auVar190._0_4_ = auVar55._0_4_ + auVar43._0_4_ * 0.33333334;
  auVar190._4_4_ = auVar55._4_4_ + auVar43._4_4_ * 0.33333334;
  auVar190._8_4_ = auVar55._8_4_ + auVar43._8_4_ * 0.33333334;
  auVar190._12_4_ = auVar55._12_4_ + auVar43._12_4_ * 0.33333334;
  auVar164._0_4_ = auVar44._0_4_ * 0.33333334;
  auVar164._4_4_ = auVar44._4_4_ * 0.33333334;
  auVar164._8_4_ = auVar44._8_4_ * 0.33333334;
  auVar164._12_4_ = auVar44._12_4_ * 0.33333334;
  auVar58 = vsubps_avx(auVar57,auVar164);
  auVar165._0_4_ = (fVar129 + auVar151._0_4_) * 0.33333334;
  auVar165._4_4_ = (fVar146 + auVar151._4_4_) * 0.33333334;
  auVar165._8_4_ = (fVar147 + auVar151._8_4_) * 0.33333334;
  auVar165._12_4_ = (fVar148 + auVar151._12_4_) * 0.33333334;
  auVar47 = vaddps_avx512vl(auVar56,auVar165);
  auVar179._0_4_ = (fVar103 + auVar163._0_4_) * 0.33333334;
  auVar179._4_4_ = (fVar108 + auVar163._4_4_) * 0.33333334;
  auVar179._8_4_ = (fVar242 + auVar163._8_4_) * 0.33333334;
  auVar179._12_4_ = (fVar226 + auVar163._12_4_) * 0.33333334;
  auVar48 = vsubps_avx512vl(auVar46,auVar179);
  auVar43 = *(undefined1 (*) [16])(lVar10 + lVar9 * lVar2);
  auVar44 = vmulps_avx512vl(auVar62,auVar88._0_16_);
  auVar44 = vfmadd231ps_avx512vl(auVar44,auVar61,auVar88._0_16_);
  auVar52 = vxorps_avx512vl(auVar51,auVar51);
  auVar52 = vfmadd213ps_avx512vl(auVar52,auVar60,auVar44);
  auVar50 = vaddps_avx512vl(auVar59,auVar52);
  auVar44 = vfmadd231ps_avx512vl(auVar44,auVar60,auVar109);
  auVar53 = vfnmadd231ps_avx512vl(auVar44,auVar59,auVar109);
  auVar44 = vmulps_avx512vl(auVar43,auVar88._0_16_);
  auVar44 = vfmadd231ps_avx512vl(auVar44,auVar23,auVar88._0_16_);
  auVar52 = vxorps_avx512vl(auVar49,auVar49);
  auVar52 = vfmadd213ps_avx512vl(auVar52,auVar64,auVar44);
  auVar51 = vaddps_avx512vl(auVar63,auVar52);
  auVar44 = vfmadd231ps_avx512vl(auVar44,auVar64,auVar109);
  auVar44 = vfnmadd231ps_avx512vl(auVar44,auVar63,auVar109);
  auVar52 = vxorps_avx512vl(auVar52,auVar52);
  auVar52 = vfmadd213ps_avx512vl(auVar52,auVar61,auVar62);
  auVar52 = vfmadd231ps_avx512vl(auVar52,auVar60,auVar88._0_16_);
  auVar49 = vfmadd231ps_avx512vl(auVar52,auVar59,auVar88._0_16_);
  auVar52 = vmulps_avx512vl(auVar62,auVar109);
  auVar52 = vfnmadd231ps_avx512vl(auVar52,auVar109,auVar61);
  auVar52 = vfmadd231ps_avx512vl(auVar52,auVar88._0_16_,auVar60);
  auVar59 = vfnmadd231ps_avx512vl(auVar52,auVar88._0_16_,auVar59);
  auVar52 = vfmadd213ps_avx512vl(ZEXT816(0) << 0x20,auVar23,auVar43);
  auVar52 = vfmadd231ps_avx512vl(auVar52,auVar64,auVar88._0_16_);
  auVar60 = vfmadd231ps_avx512vl(auVar52,auVar63,auVar88._0_16_);
  auVar43 = vmulps_avx512vl(auVar43,auVar109);
  auVar43 = vfnmadd231ps_avx512vl(auVar43,auVar109,auVar23);
  auVar43 = vfmadd231ps_avx512vl(auVar43,auVar88._0_16_,auVar64);
  auVar61 = vfnmadd231ps_avx512vl(auVar43,auVar88._0_16_,auVar63);
  auVar43 = vshufps_avx(auVar53,auVar53,0xc9);
  auVar52 = vshufps_avx512vl(auVar51,auVar51,0xc9);
  fVar242 = auVar53._0_4_;
  auVar265._0_4_ = fVar242 * auVar52._0_4_;
  fVar226 = auVar53._4_4_;
  auVar265._4_4_ = fVar226 * auVar52._4_4_;
  fVar237 = auVar53._8_4_;
  auVar265._8_4_ = fVar237 * auVar52._8_4_;
  fVar238 = auVar53._12_4_;
  auVar265._12_4_ = fVar238 * auVar52._12_4_;
  auVar52 = vfmsub231ps_avx512vl(auVar265,auVar43,auVar51);
  auVar52 = vshufps_avx(auVar52,auVar52,0xc9);
  auVar51 = vshufps_avx512vl(auVar44,auVar44,0xc9);
  auVar272._0_4_ = fVar242 * auVar51._0_4_;
  auVar272._4_4_ = fVar226 * auVar51._4_4_;
  auVar272._8_4_ = fVar237 * auVar51._8_4_;
  auVar272._12_4_ = fVar238 * auVar51._12_4_;
  auVar43 = vfmsub231ps_avx512vl(auVar272,auVar43,auVar44);
  auVar51 = vshufps_avx(auVar43,auVar43,0xc9);
  auVar44 = vshufps_avx(auVar59,auVar59,0xc9);
  auVar43 = vshufps_avx512vl(auVar60,auVar60,0xc9);
  auVar43 = vmulps_avx512vl(auVar59,auVar43);
  auVar43 = vfmsub231ps_avx512vl(auVar43,auVar44,auVar60);
  auVar60 = vshufps_avx512vl(auVar43,auVar43,0xc9);
  auVar62 = vshufps_avx512vl(auVar61,auVar61,0xc9);
  auVar43 = vdpps_avx(auVar52,auVar52,0x7f);
  auVar62 = vmulps_avx512vl(auVar59,auVar62);
  auVar44 = vfmsub231ps_avx512vl(auVar62,auVar44,auVar61);
  auVar61 = vshufps_avx512vl(auVar44,auVar44,0xc9);
  auVar87._16_16_ = auVar88._16_16_;
  auVar87._0_16_ = auVar88._0_16_;
  auVar71._4_28_ = auVar87._4_28_;
  auVar71._0_4_ = auVar43._0_4_;
  auVar44 = vrsqrt14ss_avx512f(auVar88._0_16_,auVar71._0_16_);
  auVar62 = vmulss_avx512f(auVar44,ZEXT416(0x3fc00000));
  auVar63 = vmulss_avx512f(auVar43,ZEXT416(0x3f000000));
  auVar63 = vmulss_avx512f(auVar63,auVar44);
  auVar44 = vmulss_avx512f(auVar44,auVar44);
  auVar44 = vmulss_avx512f(auVar63,auVar44);
  auVar44 = vsubss_avx512f(auVar62,auVar44);
  auVar62 = vbroadcastss_avx512vl(auVar44);
  auVar63 = vmulps_avx512vl(auVar52,auVar62);
  auVar44 = vdpps_avx(auVar52,auVar51,0x7f);
  auVar64 = vbroadcastss_avx512vl(auVar43);
  auVar51 = vmulps_avx512vl(auVar64,auVar51);
  fVar103 = auVar44._0_4_;
  auVar166._0_4_ = auVar52._0_4_ * fVar103;
  auVar166._4_4_ = auVar52._4_4_ * fVar103;
  auVar166._8_4_ = auVar52._8_4_ * fVar103;
  auVar166._12_4_ = auVar52._12_4_ * fVar103;
  auVar44 = vsubps_avx(auVar51,auVar166);
  auVar52 = vrcp14ss_avx512f(auVar88._0_16_,auVar71._0_16_);
  auVar43 = vfnmadd213ss_avx512f(auVar43,auVar52,ZEXT416(0x40000000));
  fVar103 = auVar52._0_4_ * auVar43._0_4_;
  auVar43 = vdpps_avx(auVar60,auVar60,0x7f);
  auVar110._0_4_ = fVar103 * auVar44._0_4_;
  auVar110._4_4_ = fVar103 * auVar44._4_4_;
  auVar110._8_4_ = fVar103 * auVar44._8_4_;
  auVar110._12_4_ = fVar103 * auVar44._12_4_;
  auVar52 = vmulps_avx512vl(auVar62,auVar110);
  auVar72._16_16_ = auVar88._16_16_;
  auVar72._0_16_ = auVar88._0_16_;
  auVar73._4_28_ = auVar72._4_28_;
  auVar73._0_4_ = auVar43._0_4_;
  auVar44 = vrsqrt14ss_avx512f(auVar88._0_16_,auVar73._0_16_);
  auVar51 = vmulss_avx512f(auVar44,ZEXT416(0x3fc00000));
  auVar54 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar62 = vmulss_avx512f(auVar43,ZEXT416(0x3f000000));
  auVar279 = ZEXT464(0x3f800000);
  auVar62 = vmulss_avx512f(auVar62,auVar44);
  auVar44 = vmulss_avx512f(auVar62,ZEXT416((uint)(auVar44._0_4_ * auVar44._0_4_)));
  fVar108 = auVar51._0_4_ - auVar44._0_4_;
  auVar273._0_4_ = auVar60._0_4_ * fVar108;
  auVar273._4_4_ = auVar60._4_4_ * fVar108;
  auVar273._8_4_ = auVar60._8_4_ * fVar108;
  auVar273._12_4_ = auVar60._12_4_ * fVar108;
  auVar44 = vdpps_avx(auVar60,auVar61,0x7f);
  auVar51 = vbroadcastss_avx512vl(auVar43);
  auVar51 = vmulps_avx512vl(auVar51,auVar61);
  fVar103 = auVar44._0_4_;
  auVar180._0_4_ = auVar60._0_4_ * fVar103;
  auVar180._4_4_ = auVar60._4_4_ * fVar103;
  auVar180._8_4_ = auVar60._8_4_ * fVar103;
  auVar180._12_4_ = auVar60._12_4_ * fVar103;
  auVar44 = vsubps_avx(auVar51,auVar180);
  auVar51 = vrcp14ss_avx512f(auVar88._0_16_,auVar73._0_16_);
  auVar43 = vfnmadd213ss_avx512f(auVar43,auVar51,ZEXT416(0x40000000));
  fVar103 = auVar43._0_4_ * auVar51._0_4_;
  auVar51 = vshufps_avx512vl(auVar50,auVar50,0xff);
  auVar60 = vmulps_avx512vl(auVar51,auVar63);
  auVar61 = vsubps_avx512vl(auVar50,auVar60);
  auVar43 = vshufps_avx(auVar53,auVar53,0xff);
  auVar43 = vmulps_avx512vl(auVar43,auVar63);
  auVar111._0_4_ = auVar43._0_4_ + auVar51._0_4_ * auVar52._0_4_;
  auVar111._4_4_ = auVar43._4_4_ + auVar51._4_4_ * auVar52._4_4_;
  auVar111._8_4_ = auVar43._8_4_ + auVar51._8_4_ * auVar52._8_4_;
  auVar111._12_4_ = auVar43._12_4_ + auVar51._12_4_ * auVar52._12_4_;
  auVar43 = vsubps_avx(auVar53,auVar111);
  auVar52 = vaddps_avx512vl(auVar50,auVar60);
  auVar51 = vshufps_avx512vl(auVar49,auVar49,0xff);
  auVar251._0_4_ = auVar51._0_4_ * auVar273._0_4_;
  auVar251._4_4_ = auVar51._4_4_ * auVar273._4_4_;
  auVar251._8_4_ = auVar51._8_4_ * auVar273._8_4_;
  auVar251._12_4_ = auVar51._12_4_ * auVar273._12_4_;
  auVar60 = vsubps_avx512vl(auVar49,auVar251);
  auVar62 = vshufps_avx512vl(auVar59,auVar59,0xff);
  auVar62 = vmulps_avx512vl(auVar62,auVar273);
  auVar167._0_4_ = auVar62._0_4_ + auVar51._0_4_ * fVar108 * auVar44._0_4_ * fVar103;
  auVar167._4_4_ = auVar62._4_4_ + auVar51._4_4_ * fVar108 * auVar44._4_4_ * fVar103;
  auVar167._8_4_ = auVar62._8_4_ + auVar51._8_4_ * fVar108 * auVar44._8_4_ * fVar103;
  auVar167._12_4_ = auVar62._12_4_ + auVar51._12_4_ * fVar108 * auVar44._12_4_ * fVar103;
  auVar44 = vsubps_avx(auVar59,auVar167);
  auVar51 = vaddps_avx512vl(auVar49,auVar251);
  auVar181._0_4_ = auVar61._0_4_ + auVar43._0_4_ * 0.33333334;
  auVar181._4_4_ = auVar61._4_4_ + auVar43._4_4_ * 0.33333334;
  auVar181._8_4_ = auVar61._8_4_ + auVar43._8_4_ * 0.33333334;
  auVar181._12_4_ = auVar61._12_4_ + auVar43._12_4_ * 0.33333334;
  auVar217._0_4_ = auVar44._0_4_ * 0.33333334;
  auVar217._4_4_ = auVar44._4_4_ * 0.33333334;
  auVar217._8_4_ = auVar44._8_4_ * 0.33333334;
  auVar217._12_4_ = auVar44._12_4_ * 0.33333334;
  auVar43 = vsubps_avx(auVar60,auVar217);
  auVar112._0_4_ = auVar52._0_4_ + (fVar242 + auVar111._0_4_) * 0.33333334;
  auVar112._4_4_ = auVar52._4_4_ + (fVar226 + auVar111._4_4_) * 0.33333334;
  auVar112._8_4_ = auVar52._8_4_ + (fVar237 + auVar111._8_4_) * 0.33333334;
  auVar112._12_4_ = auVar52._12_4_ + (fVar238 + auVar111._12_4_) * 0.33333334;
  auVar168._0_4_ = (auVar59._0_4_ + auVar167._0_4_) * 0.33333334;
  auVar168._4_4_ = (auVar59._4_4_ + auVar167._4_4_) * 0.33333334;
  auVar168._8_4_ = (auVar59._8_4_ + auVar167._8_4_) * 0.33333334;
  auVar168._12_4_ = (auVar59._12_4_ + auVar167._12_4_) * 0.33333334;
  auVar44 = vsubps_avx(auVar51,auVar168);
  auVar59 = vbroadcastss_avx512vl(auVar45);
  auVar62 = vsubss_avx512f(ZEXT416(0x3f800000),auVar45);
  auVar274._0_4_ = auVar62._0_4_;
  auVar274._4_4_ = auVar274._0_4_;
  auVar274._8_4_ = auVar274._0_4_;
  auVar274._12_4_ = auVar274._0_4_;
  auVar61 = vmulps_avx512vl(auVar59,auVar61);
  auVar62 = vmulps_avx512vl(auVar59,auVar181);
  auVar43 = vmulps_avx512vl(auVar59,auVar43);
  auVar266._0_4_ = auVar59._0_4_ * auVar60._0_4_;
  auVar266._4_4_ = auVar59._4_4_ * auVar60._4_4_;
  auVar266._8_4_ = auVar59._8_4_ * auVar60._8_4_;
  auVar266._12_4_ = auVar59._12_4_ * auVar60._12_4_;
  local_320 = vfmadd231ps_avx512vl(auVar61,auVar274,auVar55);
  local_330 = vfmadd231ps_avx512vl(auVar62,auVar274,auVar190);
  local_340 = vfmadd231ps_avx512vl(auVar43,auVar274,auVar58);
  local_350 = vfmadd231ps_fma(auVar266,auVar274,auVar57);
  auVar43 = vmulps_avx512vl(auVar59,auVar52);
  auVar52 = vmulps_avx512vl(auVar59,auVar112);
  auVar44 = vmulps_avx512vl(auVar59,auVar44);
  auVar259._0_4_ = auVar59._0_4_ * auVar51._0_4_;
  auVar259._4_4_ = auVar59._4_4_ * auVar51._4_4_;
  auVar259._8_4_ = auVar59._8_4_ * auVar51._8_4_;
  auVar259._12_4_ = auVar59._12_4_ * auVar51._12_4_;
  _local_360 = vfmadd231ps_avx512vl(auVar43,auVar274,auVar56);
  _local_370 = vfmadd231ps_avx512vl(auVar52,auVar274,auVar47);
  _local_380 = vfmadd231ps_avx512vl(auVar44,auVar274,auVar48);
  _local_390 = vfmadd231ps_fma(auVar259,auVar274,auVar46);
  auVar43 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar43 = vinsertps_avx(auVar43,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  local_2a0 = vsubps_avx512vl(local_320,auVar43);
  uVar104 = local_2a0._0_4_;
  auVar113._4_4_ = uVar104;
  auVar113._0_4_ = uVar104;
  auVar113._8_4_ = uVar104;
  auVar113._12_4_ = uVar104;
  auVar44 = vshufps_avx(local_2a0,local_2a0,0x55);
  auVar52 = vshufps_avx(local_2a0,local_2a0,0xaa);
  aVar3 = pre->ray_space[k].vx.field_0;
  aVar4 = pre->ray_space[k].vy.field_0;
  fVar103 = pre->ray_space[k].vz.field_0.m128[0];
  fVar108 = pre->ray_space[k].vz.field_0.m128[1];
  fVar242 = pre->ray_space[k].vz.field_0.m128[2];
  fVar226 = pre->ray_space[k].vz.field_0.m128[3];
  auVar106._0_4_ = fVar103 * auVar52._0_4_;
  auVar106._4_4_ = fVar108 * auVar52._4_4_;
  auVar106._8_4_ = fVar242 * auVar52._8_4_;
  auVar106._12_4_ = fVar226 * auVar52._12_4_;
  auVar44 = vfmadd231ps_fma(auVar106,(undefined1  [16])aVar4,auVar44);
  auVar57 = vfmadd231ps_fma(auVar44,(undefined1  [16])aVar3,auVar113);
  local_2b0 = vsubps_avx512vl(local_330,auVar43);
  uVar104 = local_2b0._0_4_;
  auVar131._4_4_ = uVar104;
  auVar131._0_4_ = uVar104;
  auVar131._8_4_ = uVar104;
  auVar131._12_4_ = uVar104;
  auVar44 = vshufps_avx(local_2b0,local_2b0,0x55);
  auVar52 = vshufps_avx(local_2b0,local_2b0,0xaa);
  auVar114._0_4_ = fVar103 * auVar52._0_4_;
  auVar114._4_4_ = fVar108 * auVar52._4_4_;
  auVar114._8_4_ = fVar242 * auVar52._8_4_;
  auVar114._12_4_ = fVar226 * auVar52._12_4_;
  auVar44 = vfmadd231ps_fma(auVar114,(undefined1  [16])aVar4,auVar44);
  auVar59 = vfmadd231ps_fma(auVar44,(undefined1  [16])aVar3,auVar131);
  local_2c0 = vsubps_avx512vl(local_340,auVar43);
  uVar104 = local_2c0._0_4_;
  auVar132._4_4_ = uVar104;
  auVar132._0_4_ = uVar104;
  auVar132._8_4_ = uVar104;
  auVar132._12_4_ = uVar104;
  auVar44 = vshufps_avx(local_2c0,local_2c0,0x55);
  auVar52 = vshufps_avx(local_2c0,local_2c0,0xaa);
  auVar206._0_4_ = auVar52._0_4_ * fVar103;
  auVar206._4_4_ = auVar52._4_4_ * fVar108;
  auVar206._8_4_ = auVar52._8_4_ * fVar242;
  auVar206._12_4_ = auVar52._12_4_ * fVar226;
  auVar44 = vfmadd231ps_fma(auVar206,(undefined1  [16])aVar4,auVar44);
  auVar60 = vfmadd231ps_fma(auVar44,(undefined1  [16])aVar3,auVar132);
  local_2d0 = vsubps_avx(local_350,auVar43);
  uVar104 = local_2d0._0_4_;
  auVar133._4_4_ = uVar104;
  auVar133._0_4_ = uVar104;
  auVar133._8_4_ = uVar104;
  auVar133._12_4_ = uVar104;
  auVar44 = vshufps_avx(local_2d0,local_2d0,0x55);
  auVar52 = vshufps_avx(local_2d0,local_2d0,0xaa);
  auVar218._0_4_ = auVar52._0_4_ * fVar103;
  auVar218._4_4_ = auVar52._4_4_ * fVar108;
  auVar218._8_4_ = auVar52._8_4_ * fVar242;
  auVar218._12_4_ = auVar52._12_4_ * fVar226;
  auVar44 = vfmadd231ps_fma(auVar218,(undefined1  [16])aVar4,auVar44);
  auVar61 = vfmadd231ps_fma(auVar44,(undefined1  [16])aVar3,auVar133);
  local_2e0 = vsubps_avx512vl(_local_360,auVar43);
  uVar104 = local_2e0._0_4_;
  auVar134._4_4_ = uVar104;
  auVar134._0_4_ = uVar104;
  auVar134._8_4_ = uVar104;
  auVar134._12_4_ = uVar104;
  auVar44 = vshufps_avx(local_2e0,local_2e0,0x55);
  auVar52 = vshufps_avx(local_2e0,local_2e0,0xaa);
  auVar227._0_4_ = auVar52._0_4_ * fVar103;
  auVar227._4_4_ = auVar52._4_4_ * fVar108;
  auVar227._8_4_ = auVar52._8_4_ * fVar242;
  auVar227._12_4_ = auVar52._12_4_ * fVar226;
  auVar44 = vfmadd231ps_fma(auVar227,(undefined1  [16])aVar4,auVar44);
  auVar62 = vfmadd231ps_fma(auVar44,(undefined1  [16])aVar3,auVar134);
  local_2f0 = vsubps_avx512vl(_local_370,auVar43);
  uVar104 = local_2f0._0_4_;
  auVar135._4_4_ = uVar104;
  auVar135._0_4_ = uVar104;
  auVar135._8_4_ = uVar104;
  auVar135._12_4_ = uVar104;
  auVar44 = vshufps_avx(local_2f0,local_2f0,0x55);
  auVar52 = vshufps_avx(local_2f0,local_2f0,0xaa);
  auVar243._0_4_ = auVar52._0_4_ * fVar103;
  auVar243._4_4_ = auVar52._4_4_ * fVar108;
  auVar243._8_4_ = auVar52._8_4_ * fVar242;
  auVar243._12_4_ = auVar52._12_4_ * fVar226;
  auVar44 = vfmadd231ps_fma(auVar243,(undefined1  [16])aVar4,auVar44);
  auVar63 = vfmadd231ps_fma(auVar44,(undefined1  [16])aVar3,auVar135);
  local_300 = vsubps_avx512vl(_local_380,auVar43);
  uVar104 = local_300._0_4_;
  auVar136._4_4_ = uVar104;
  auVar136._0_4_ = uVar104;
  auVar136._8_4_ = uVar104;
  auVar136._12_4_ = uVar104;
  auVar44 = vshufps_avx(local_300,local_300,0x55);
  auVar52 = vshufps_avx(local_300,local_300,0xaa);
  auVar252._0_4_ = auVar52._0_4_ * fVar103;
  auVar252._4_4_ = auVar52._4_4_ * fVar108;
  auVar252._8_4_ = auVar52._8_4_ * fVar242;
  auVar252._12_4_ = auVar52._12_4_ * fVar226;
  auVar44 = vfmadd231ps_fma(auVar252,(undefined1  [16])aVar4,auVar44);
  auVar64 = vfmadd231ps_fma(auVar44,(undefined1  [16])aVar3,auVar136);
  local_310 = vsubps_avx(_local_390,auVar43);
  uVar104 = local_310._0_4_;
  auVar122._4_4_ = uVar104;
  auVar122._0_4_ = uVar104;
  auVar122._8_4_ = uVar104;
  auVar122._12_4_ = uVar104;
  auVar43 = vshufps_avx(local_310,local_310,0x55);
  auVar44 = vshufps_avx(local_310,local_310,0xaa);
  auVar182._0_4_ = fVar103 * auVar44._0_4_;
  auVar182._4_4_ = fVar108 * auVar44._4_4_;
  auVar182._8_4_ = fVar242 * auVar44._8_4_;
  auVar182._12_4_ = fVar226 * auVar44._12_4_;
  auVar43 = vfmadd231ps_fma(auVar182,(undefined1  [16])aVar4,auVar43);
  auVar23 = vfmadd231ps_fma(auVar43,(undefined1  [16])aVar3,auVar122);
  auVar56 = vmovlhps_avx512f(auVar57,auVar62);
  auVar52 = vmovlhps_avx(auVar59,auVar63);
  auVar51 = vmovlhps_avx(auVar60,auVar64);
  auVar58 = vmovlhps_avx(auVar61,auVar23);
  auVar44 = vminps_avx512vl(auVar56,auVar52);
  auVar55 = vmaxps_avx512vl(auVar56,auVar52);
  auVar43 = vminps_avx(auVar51,auVar58);
  auVar44 = vminps_avx(auVar44,auVar43);
  auVar43 = vmaxps_avx(auVar51,auVar58);
  auVar43 = vmaxps_avx(auVar55,auVar43);
  auVar55 = vshufpd_avx(auVar44,auVar44,3);
  auVar44 = vminps_avx(auVar44,auVar55);
  auVar55 = vshufpd_avx(auVar43,auVar43,3);
  auVar43 = vmaxps_avx(auVar43,auVar55);
  auVar44 = vandps_avx512vl(auVar44,auVar278._0_16_);
  auVar43 = vandps_avx512vl(auVar43,auVar278._0_16_);
  auVar43 = vmaxps_avx(auVar44,auVar43);
  auVar44 = vmovshdup_avx(auVar43);
  auVar43 = vmaxss_avx(auVar44,auVar43);
  fVar108 = auVar43._0_4_ * 9.536743e-07;
  auVar44 = vmovddup_avx512vl(auVar57);
  auVar55 = vmovddup_avx512vl(auVar59);
  auVar207._0_8_ = auVar60._0_8_;
  auVar207._8_8_ = auVar207._0_8_;
  auVar219._0_8_ = auVar61._0_8_;
  auVar219._8_8_ = auVar219._0_8_;
  local_1c0 = vbroadcastss_avx512vl(ZEXT416((uint)fVar108));
  auVar43 = vxorps_avx512vl(local_1c0._0_16_,auVar54);
  local_1e0 = vbroadcastss_avx512vl(auVar43);
  bVar40 = false;
  uVar32 = 0;
  fVar103 = *(float *)(ray + k * 4 + 0x60);
  local_270 = vsubps_avx512vl(auVar52,auVar56);
  local_280 = vsubps_avx(auVar51,auVar52);
  local_290 = vsubps_avx(auVar58,auVar51);
  local_3b0 = vsubps_avx512vl(_local_360,local_320);
  local_3c0 = vsubps_avx512vl(_local_370,local_330);
  local_3d0 = vsubps_avx512vl(_local_380,local_340);
  _local_3e0 = vsubps_avx(_local_390,local_350);
  local_220 = vpbroadcastd_avx512vl();
  auVar43 = ZEXT816(0x3f80000000000000);
  auVar276 = ZEXT1664(auVar43);
  do {
    auVar280 = ZEXT3264(local_1e0);
    auVar48 = auVar276._0_16_;
    auVar57 = vshufps_avx(auVar48,auVar48,0x50);
    auVar260._8_4_ = 0x3f800000;
    auVar260._0_8_ = &DAT_3f8000003f800000;
    auVar260._12_4_ = 0x3f800000;
    auVar263._16_4_ = 0x3f800000;
    auVar263._0_16_ = auVar260;
    auVar263._20_4_ = 0x3f800000;
    auVar263._24_4_ = 0x3f800000;
    auVar263._28_4_ = 0x3f800000;
    auVar59 = vsubps_avx(auVar260,auVar57);
    fVar242 = auVar57._0_4_;
    fVar130 = auVar62._0_4_;
    auVar137._0_4_ = fVar130 * fVar242;
    fVar226 = auVar57._4_4_;
    fVar129 = auVar62._4_4_;
    auVar137._4_4_ = fVar129 * fVar226;
    fVar237 = auVar57._8_4_;
    auVar137._8_4_ = fVar130 * fVar237;
    fVar238 = auVar57._12_4_;
    auVar137._12_4_ = fVar129 * fVar238;
    fVar146 = auVar63._0_4_;
    auVar152._0_4_ = fVar146 * fVar242;
    fVar147 = auVar63._4_4_;
    auVar152._4_4_ = fVar147 * fVar226;
    auVar152._8_4_ = fVar146 * fVar237;
    auVar152._12_4_ = fVar147 * fVar238;
    fVar225 = auVar64._0_4_;
    auVar169._0_4_ = fVar225 * fVar242;
    fVar236 = auVar64._4_4_;
    auVar169._4_4_ = fVar236 * fVar226;
    auVar169._8_4_ = fVar225 * fVar237;
    auVar169._12_4_ = fVar236 * fVar238;
    fVar148 = auVar23._0_4_;
    auVar115._0_4_ = fVar148 * fVar242;
    fVar187 = auVar23._4_4_;
    auVar115._4_4_ = fVar187 * fVar226;
    auVar115._8_4_ = fVar148 * fVar237;
    auVar115._12_4_ = fVar187 * fVar238;
    auVar61 = vfmadd231ps_avx512vl(auVar137,auVar59,auVar44);
    auVar45 = vfmadd231ps_avx512vl(auVar152,auVar59,auVar55);
    auVar60 = vfmadd231ps_fma(auVar169,auVar59,auVar207);
    auVar59 = vfmadd231ps_fma(auVar115,auVar219,auVar59);
    auVar57 = vmovshdup_avx(auVar43);
    fVar226 = auVar43._0_4_;
    fVar242 = (auVar57._0_4_ - fVar226) * 0.04761905;
    auVar143._4_4_ = fVar226;
    auVar143._0_4_ = fVar226;
    auVar143._8_4_ = fVar226;
    auVar143._12_4_ = fVar226;
    auVar143._16_4_ = fVar226;
    auVar143._20_4_ = fVar226;
    auVar143._24_4_ = fVar226;
    auVar143._28_4_ = fVar226;
    auVar79._0_8_ = auVar57._0_8_;
    auVar79._8_8_ = auVar79._0_8_;
    auVar79._16_8_ = auVar79._0_8_;
    auVar79._24_8_ = auVar79._0_8_;
    auVar88 = vsubps_avx(auVar79,auVar143);
    uVar104 = auVar61._0_4_;
    auVar90._4_4_ = uVar104;
    auVar90._0_4_ = uVar104;
    auVar90._8_4_ = uVar104;
    auVar90._12_4_ = uVar104;
    auVar90._16_4_ = uVar104;
    auVar90._20_4_ = uVar104;
    auVar90._24_4_ = uVar104;
    auVar90._28_4_ = uVar104;
    auVar80._8_4_ = 1;
    auVar80._0_8_ = 0x100000001;
    auVar80._12_4_ = 1;
    auVar80._16_4_ = 1;
    auVar80._20_4_ = 1;
    auVar80._24_4_ = 1;
    auVar80._28_4_ = 1;
    auVar86 = ZEXT1632(auVar61);
    auVar84 = vpermps_avx2(auVar80,auVar86);
    auVar70 = vbroadcastss_avx512vl(auVar45);
    auVar87 = ZEXT1632(auVar45);
    auVar71 = vpermps_avx512vl(auVar80,auVar87);
    auVar72 = vbroadcastss_avx512vl(auVar60);
    auVar85 = ZEXT1632(auVar60);
    auVar73 = vpermps_avx512vl(auVar80,auVar85);
    auVar74 = vbroadcastss_avx512vl(auVar59);
    auVar83 = ZEXT1632(auVar59);
    auVar75 = vpermps_avx512vl(auVar80,auVar83);
    auVar223._4_4_ = fVar242;
    auVar223._0_4_ = fVar242;
    auVar223._8_4_ = fVar242;
    auVar223._12_4_ = fVar242;
    auVar223._16_4_ = fVar242;
    auVar223._20_4_ = fVar242;
    auVar223._24_4_ = fVar242;
    auVar223._28_4_ = fVar242;
    auVar81._8_4_ = 2;
    auVar81._0_8_ = 0x200000002;
    auVar81._12_4_ = 2;
    auVar81._16_4_ = 2;
    auVar81._20_4_ = 2;
    auVar81._24_4_ = 2;
    auVar81._28_4_ = 2;
    auVar76 = vpermps_avx512vl(auVar81,auVar86);
    auVar77 = vbroadcastss_avx512vl(ZEXT416(3));
    auVar78 = vpermps_avx512vl(auVar77,auVar86);
    auVar86 = vpermps_avx2(auVar81,auVar87);
    auVar79 = vpermps_avx512vl(auVar77,auVar87);
    auVar87 = vpermps_avx2(auVar81,auVar85);
    auVar80 = vpermps_avx512vl(auVar77,auVar85);
    auVar81 = vpermps_avx512vl(auVar81,auVar83);
    auVar82 = vpermps_avx512vl(auVar77,auVar83);
    auVar57 = vfmadd132ps_fma(auVar88,auVar143,_DAT_02020f20);
    auVar88 = vsubps_avx(auVar263,ZEXT1632(auVar57));
    auVar77 = vmulps_avx512vl(auVar70,ZEXT1632(auVar57));
    auVar85 = ZEXT1632(auVar57);
    auVar83 = vmulps_avx512vl(auVar71,auVar85);
    auVar59 = vfmadd231ps_fma(auVar77,auVar88,auVar90);
    auVar60 = vfmadd231ps_fma(auVar83,auVar88,auVar84);
    auVar77 = vmulps_avx512vl(auVar72,auVar85);
    auVar83 = vmulps_avx512vl(auVar73,auVar85);
    auVar70 = vfmadd231ps_avx512vl(auVar77,auVar88,auVar70);
    auVar71 = vfmadd231ps_avx512vl(auVar83,auVar88,auVar71);
    auVar77 = vmulps_avx512vl(auVar74,auVar85);
    auVar90 = ZEXT1632(auVar57);
    auVar75 = vmulps_avx512vl(auVar75,auVar90);
    auVar72 = vfmadd231ps_avx512vl(auVar77,auVar88,auVar72);
    auVar73 = vfmadd231ps_avx512vl(auVar75,auVar88,auVar73);
    fVar237 = auVar57._0_4_;
    fVar238 = auVar57._4_4_;
    auVar75._4_4_ = fVar238 * auVar70._4_4_;
    auVar75._0_4_ = fVar237 * auVar70._0_4_;
    fVar239 = auVar57._8_4_;
    auVar75._8_4_ = fVar239 * auVar70._8_4_;
    fVar240 = auVar57._12_4_;
    auVar75._12_4_ = fVar240 * auVar70._12_4_;
    auVar75._16_4_ = auVar70._16_4_ * 0.0;
    auVar75._20_4_ = auVar70._20_4_ * 0.0;
    auVar75._24_4_ = auVar70._24_4_ * 0.0;
    auVar75._28_4_ = fVar226;
    auVar77._4_4_ = fVar238 * auVar71._4_4_;
    auVar77._0_4_ = fVar237 * auVar71._0_4_;
    auVar77._8_4_ = fVar239 * auVar71._8_4_;
    auVar77._12_4_ = fVar240 * auVar71._12_4_;
    auVar77._16_4_ = auVar71._16_4_ * 0.0;
    auVar77._20_4_ = auVar71._20_4_ * 0.0;
    auVar77._24_4_ = auVar71._24_4_ * 0.0;
    auVar77._28_4_ = auVar84._28_4_;
    auVar59 = vfmadd231ps_fma(auVar75,auVar88,ZEXT1632(auVar59));
    auVar60 = vfmadd231ps_fma(auVar77,auVar88,ZEXT1632(auVar60));
    auVar89._0_4_ = fVar237 * auVar72._0_4_;
    auVar89._4_4_ = fVar238 * auVar72._4_4_;
    auVar89._8_4_ = fVar239 * auVar72._8_4_;
    auVar89._12_4_ = fVar240 * auVar72._12_4_;
    auVar89._16_4_ = auVar72._16_4_ * 0.0;
    auVar89._20_4_ = auVar72._20_4_ * 0.0;
    auVar89._24_4_ = auVar72._24_4_ * 0.0;
    auVar89._28_4_ = 0;
    auVar83._4_4_ = fVar238 * auVar73._4_4_;
    auVar83._0_4_ = fVar237 * auVar73._0_4_;
    auVar83._8_4_ = fVar239 * auVar73._8_4_;
    auVar83._12_4_ = fVar240 * auVar73._12_4_;
    auVar83._16_4_ = auVar73._16_4_ * 0.0;
    auVar83._20_4_ = auVar73._20_4_ * 0.0;
    auVar83._24_4_ = auVar73._24_4_ * 0.0;
    auVar83._28_4_ = auVar72._28_4_;
    auVar61 = vfmadd231ps_fma(auVar89,auVar88,auVar70);
    auVar45 = vfmadd231ps_fma(auVar83,auVar88,auVar71);
    auVar85._28_4_ = auVar71._28_4_;
    auVar85._0_28_ =
         ZEXT1628(CONCAT412(fVar240 * auVar45._12_4_,
                            CONCAT48(fVar239 * auVar45._8_4_,
                                     CONCAT44(fVar238 * auVar45._4_4_,fVar237 * auVar45._0_4_))));
    auVar46 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar240 * auVar61._12_4_,
                                                 CONCAT48(fVar239 * auVar61._8_4_,
                                                          CONCAT44(fVar238 * auVar61._4_4_,
                                                                   fVar237 * auVar61._0_4_)))),
                              auVar88,ZEXT1632(auVar59));
    auVar47 = vfmadd231ps_fma(auVar85,auVar88,ZEXT1632(auVar60));
    auVar84 = vsubps_avx(ZEXT1632(auVar61),ZEXT1632(auVar59));
    auVar70 = vsubps_avx(ZEXT1632(auVar45),ZEXT1632(auVar60));
    auVar71 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar84 = vmulps_avx512vl(auVar84,auVar71);
    auVar70 = vmulps_avx512vl(auVar70,auVar71);
    auVar156._0_4_ = fVar242 * auVar84._0_4_;
    auVar156._4_4_ = fVar242 * auVar84._4_4_;
    auVar156._8_4_ = fVar242 * auVar84._8_4_;
    auVar156._12_4_ = fVar242 * auVar84._12_4_;
    auVar156._16_4_ = fVar242 * auVar84._16_4_;
    auVar156._20_4_ = fVar242 * auVar84._20_4_;
    auVar156._24_4_ = fVar242 * auVar84._24_4_;
    auVar156._28_4_ = 0;
    auVar84 = vmulps_avx512vl(auVar223,auVar70);
    auVar61 = vxorps_avx512vl(auVar74._0_16_,auVar74._0_16_);
    auVar70 = vpermt2ps_avx512vl(ZEXT1632(auVar46),_DAT_0205fd20,ZEXT1632(auVar61));
    auVar72 = vpermt2ps_avx512vl(ZEXT1632(auVar47),_DAT_0205fd20,ZEXT1632(auVar61));
    auVar121._0_4_ = auVar156._0_4_ + auVar46._0_4_;
    auVar121._4_4_ = auVar156._4_4_ + auVar46._4_4_;
    auVar121._8_4_ = auVar156._8_4_ + auVar46._8_4_;
    auVar121._12_4_ = auVar156._12_4_ + auVar46._12_4_;
    auVar121._16_4_ = auVar156._16_4_ + 0.0;
    auVar121._20_4_ = auVar156._20_4_ + 0.0;
    auVar121._24_4_ = auVar156._24_4_ + 0.0;
    auVar121._28_4_ = 0;
    auVar89 = ZEXT1632(auVar61);
    auVar73 = vpermt2ps_avx512vl(auVar156,_DAT_0205fd20,auVar89);
    auVar75 = vaddps_avx512vl(ZEXT1632(auVar47),auVar84);
    auVar77 = vpermt2ps_avx512vl(auVar84,_DAT_0205fd20,auVar89);
    auVar84 = vsubps_avx(auVar70,auVar73);
    auVar73 = vsubps_avx512vl(auVar72,auVar77);
    auVar77 = vmulps_avx512vl(auVar86,auVar90);
    auVar83 = vmulps_avx512vl(auVar79,auVar90);
    auVar77 = vfmadd231ps_avx512vl(auVar77,auVar88,auVar76);
    auVar83 = vfmadd231ps_avx512vl(auVar83,auVar88,auVar78);
    auVar85 = vmulps_avx512vl(auVar87,auVar90);
    auVar74 = vmulps_avx512vl(auVar80,auVar90);
    auVar86 = vfmadd231ps_avx512vl(auVar85,auVar88,auVar86);
    auVar85 = vfmadd231ps_avx512vl(auVar74,auVar88,auVar79);
    auVar74 = vmulps_avx512vl(auVar81,auVar90);
    auVar76 = vmulps_avx512vl(auVar82,auVar90);
    auVar59 = vfmadd231ps_fma(auVar74,auVar88,auVar87);
    auVar60 = vfmadd231ps_fma(auVar76,auVar88,auVar80);
    auVar74 = vmulps_avx512vl(auVar90,auVar86);
    auVar76 = vmulps_avx512vl(ZEXT1632(auVar57),auVar85);
    auVar77 = vfmadd231ps_avx512vl(auVar74,auVar88,auVar77);
    auVar83 = vfmadd231ps_avx512vl(auVar76,auVar88,auVar83);
    auVar86 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar240 * auVar59._12_4_,
                                            CONCAT48(fVar239 * auVar59._8_4_,
                                                     CONCAT44(fVar238 * auVar59._4_4_,
                                                              fVar237 * auVar59._0_4_)))),auVar88,
                         auVar86);
    auVar85 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar240 * auVar60._12_4_,
                                            CONCAT48(fVar239 * auVar60._8_4_,
                                                     CONCAT44(fVar238 * auVar60._4_4_,
                                                              fVar237 * auVar60._0_4_)))),auVar88,
                         auVar85);
    auVar74._4_4_ = fVar238 * auVar86._4_4_;
    auVar74._0_4_ = fVar237 * auVar86._0_4_;
    auVar74._8_4_ = fVar239 * auVar86._8_4_;
    auVar74._12_4_ = fVar240 * auVar86._12_4_;
    auVar74._16_4_ = auVar86._16_4_ * 0.0;
    auVar74._20_4_ = auVar86._20_4_ * 0.0;
    auVar74._24_4_ = auVar86._24_4_ * 0.0;
    auVar74._28_4_ = auVar80._28_4_;
    auVar76._4_4_ = fVar238 * auVar85._4_4_;
    auVar76._0_4_ = fVar237 * auVar85._0_4_;
    auVar76._8_4_ = fVar239 * auVar85._8_4_;
    auVar76._12_4_ = fVar240 * auVar85._12_4_;
    auVar76._16_4_ = auVar85._16_4_ * 0.0;
    auVar76._20_4_ = auVar85._20_4_ * 0.0;
    auVar76._24_4_ = auVar85._24_4_ * 0.0;
    auVar76._28_4_ = auVar87._28_4_;
    auVar87 = vfmadd231ps_avx512vl(auVar74,auVar88,auVar77);
    auVar74 = vfmadd231ps_avx512vl(auVar76,auVar83,auVar88);
    auVar88 = vsubps_avx512vl(auVar86,auVar77);
    auVar86 = vsubps_avx512vl(auVar85,auVar83);
    auVar88 = vmulps_avx512vl(auVar88,auVar71);
    auVar86 = vmulps_avx512vl(auVar86,auVar71);
    fVar226 = fVar242 * auVar88._0_4_;
    fVar237 = fVar242 * auVar88._4_4_;
    auVar78._4_4_ = fVar237;
    auVar78._0_4_ = fVar226;
    fVar238 = fVar242 * auVar88._8_4_;
    auVar78._8_4_ = fVar238;
    fVar239 = fVar242 * auVar88._12_4_;
    auVar78._12_4_ = fVar239;
    fVar240 = fVar242 * auVar88._16_4_;
    auVar78._16_4_ = fVar240;
    fVar241 = fVar242 * auVar88._20_4_;
    auVar78._20_4_ = fVar241;
    fVar242 = fVar242 * auVar88._24_4_;
    auVar78._24_4_ = fVar242;
    auVar78._28_4_ = auVar88._28_4_;
    auVar86 = vmulps_avx512vl(auVar223,auVar86);
    auVar71 = vpermt2ps_avx512vl(auVar87,_DAT_0205fd20,auVar89);
    auVar77 = vpermt2ps_avx512vl(auVar74,_DAT_0205fd20,auVar89);
    auVar224._0_4_ = auVar87._0_4_ + fVar226;
    auVar224._4_4_ = auVar87._4_4_ + fVar237;
    auVar224._8_4_ = auVar87._8_4_ + fVar238;
    auVar224._12_4_ = auVar87._12_4_ + fVar239;
    auVar224._16_4_ = auVar87._16_4_ + fVar240;
    auVar224._20_4_ = auVar87._20_4_ + fVar241;
    auVar224._24_4_ = auVar87._24_4_ + fVar242;
    auVar224._28_4_ = auVar87._28_4_ + auVar88._28_4_;
    auVar88 = vpermt2ps_avx512vl(auVar78,_DAT_0205fd20,ZEXT1632(auVar61));
    auVar83 = vaddps_avx512vl(auVar74,auVar86);
    auVar86 = vpermt2ps_avx512vl(auVar86,_DAT_0205fd20,ZEXT1632(auVar61));
    auVar88 = vsubps_avx(auVar71,auVar88);
    auVar86 = vsubps_avx512vl(auVar77,auVar86);
    auVar143 = ZEXT1632(auVar46);
    auVar85 = vsubps_avx512vl(auVar87,auVar143);
    auVar156 = ZEXT1632(auVar47);
    auVar76 = vsubps_avx512vl(auVar74,auVar156);
    auVar78 = vsubps_avx512vl(auVar71,auVar70);
    auVar85 = vaddps_avx512vl(auVar85,auVar78);
    auVar78 = vsubps_avx512vl(auVar77,auVar72);
    auVar76 = vaddps_avx512vl(auVar76,auVar78);
    auVar78 = vmulps_avx512vl(auVar156,auVar85);
    auVar78 = vfnmadd231ps_avx512vl(auVar78,auVar143,auVar76);
    auVar79 = vmulps_avx512vl(auVar75,auVar85);
    auVar79 = vfnmadd231ps_avx512vl(auVar79,auVar121,auVar76);
    auVar80 = vmulps_avx512vl(auVar73,auVar85);
    auVar80 = vfnmadd231ps_avx512vl(auVar80,auVar84,auVar76);
    auVar81 = vmulps_avx512vl(auVar72,auVar85);
    auVar81 = vfnmadd231ps_avx512vl(auVar81,auVar70,auVar76);
    auVar82 = vmulps_avx512vl(auVar74,auVar85);
    auVar82 = vfnmadd231ps_avx512vl(auVar82,auVar87,auVar76);
    auVar89 = vmulps_avx512vl(auVar83,auVar85);
    auVar89 = vfnmadd231ps_avx512vl(auVar89,auVar224,auVar76);
    auVar90 = vmulps_avx512vl(auVar86,auVar85);
    auVar90 = vfnmadd231ps_avx512vl(auVar90,auVar88,auVar76);
    auVar85 = vmulps_avx512vl(auVar77,auVar85);
    auVar85 = vfnmadd231ps_avx512vl(auVar85,auVar71,auVar76);
    auVar76 = vminps_avx512vl(auVar78,auVar79);
    auVar78 = vmaxps_avx512vl(auVar78,auVar79);
    auVar79 = vminps_avx512vl(auVar80,auVar81);
    auVar76 = vminps_avx512vl(auVar76,auVar79);
    auVar79 = vmaxps_avx512vl(auVar80,auVar81);
    auVar78 = vmaxps_avx512vl(auVar78,auVar79);
    auVar79 = vminps_avx512vl(auVar82,auVar89);
    auVar80 = vmaxps_avx512vl(auVar82,auVar89);
    auVar81 = vminps_avx512vl(auVar90,auVar85);
    auVar79 = vminps_avx512vl(auVar79,auVar81);
    auVar76 = vminps_avx512vl(auVar76,auVar79);
    auVar85 = vmaxps_avx512vl(auVar90,auVar85);
    auVar85 = vmaxps_avx512vl(auVar80,auVar85);
    auVar85 = vmaxps_avx512vl(auVar78,auVar85);
    uVar20 = vcmpps_avx512vl(auVar76,local_1c0,2);
    uVar21 = vcmpps_avx512vl(auVar85,local_1e0,5);
    uVar37 = 0;
    bVar30 = (byte)uVar20 & (byte)uVar21 & 0x7f;
    if (bVar30 != 0) {
      auVar85 = vsubps_avx512vl(auVar70,auVar143);
      auVar76 = vsubps_avx512vl(auVar72,auVar156);
      auVar78 = vsubps_avx512vl(auVar71,auVar87);
      auVar85 = vaddps_avx512vl(auVar85,auVar78);
      auVar78 = vsubps_avx512vl(auVar77,auVar74);
      auVar76 = vaddps_avx512vl(auVar76,auVar78);
      auVar78 = vmulps_avx512vl(auVar156,auVar85);
      auVar78 = vfnmadd231ps_avx512vl(auVar78,auVar76,auVar143);
      auVar75 = vmulps_avx512vl(auVar75,auVar85);
      auVar75 = vfnmadd213ps_avx512vl(auVar121,auVar76,auVar75);
      auVar73 = vmulps_avx512vl(auVar73,auVar85);
      auVar73 = vfnmadd213ps_avx512vl(auVar84,auVar76,auVar73);
      auVar84 = vmulps_avx512vl(auVar72,auVar85);
      auVar72 = vfnmadd231ps_avx512vl(auVar84,auVar76,auVar70);
      auVar84 = vmulps_avx512vl(auVar74,auVar85);
      auVar87 = vfnmadd231ps_avx512vl(auVar84,auVar76,auVar87);
      auVar84 = vmulps_avx512vl(auVar83,auVar85);
      auVar83 = vfnmadd213ps_avx512vl(auVar224,auVar76,auVar84);
      auVar84 = vmulps_avx512vl(auVar86,auVar85);
      auVar74 = vfnmadd213ps_avx512vl(auVar88,auVar76,auVar84);
      auVar88 = vmulps_avx512vl(auVar77,auVar85);
      auVar71 = vfnmadd231ps_avx512vl(auVar88,auVar71,auVar76);
      auVar84 = vminps_avx(auVar78,auVar75);
      auVar88 = vmaxps_avx(auVar78,auVar75);
      auVar70 = vminps_avx(auVar73,auVar72);
      auVar70 = vminps_avx(auVar84,auVar70);
      auVar84 = vmaxps_avx(auVar73,auVar72);
      auVar88 = vmaxps_avx(auVar88,auVar84);
      auVar86 = vminps_avx(auVar87,auVar83);
      auVar84 = vmaxps_avx(auVar87,auVar83);
      auVar87 = vminps_avx(auVar74,auVar71);
      auVar86 = vminps_avx(auVar86,auVar87);
      auVar86 = vminps_avx(auVar70,auVar86);
      auVar70 = vmaxps_avx(auVar74,auVar71);
      auVar84 = vmaxps_avx(auVar84,auVar70);
      auVar88 = vmaxps_avx(auVar88,auVar84);
      uVar20 = vcmpps_avx512vl(auVar88,local_1e0,5);
      uVar21 = vcmpps_avx512vl(auVar86,local_1c0,2);
      uVar37 = (uint)(bVar30 & (byte)uVar20 & (byte)uVar21);
    }
    if (uVar37 != 0) {
      auStack_440[uVar32] = uVar37;
      uVar20 = vmovlps_avx(auVar43);
      *(undefined8 *)(&uStack_260 + uVar32 * 2) = uVar20;
      uVar35 = vmovlps_avx(auVar48);
      auStack_1a0[uVar32] = uVar35;
      uVar32 = (ulong)((int)uVar32 + 1);
    }
    auVar43 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar277 = ZEXT1664(auVar43);
    auVar88 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    in_ZMM17 = ZEXT3264(auVar88);
    in_ZMM22 = ZEXT464(0x38d1b717);
    do {
      in_ZMM18 = ZEXT464(0x3e124925);
      auVar60 = auVar282._0_16_;
      auVar59 = auVar277._0_16_;
      auVar43 = SUB6416(ZEXT464(0xb8d1b717),0);
      auVar57 = SUB6416(ZEXT464(0x38d1b717),0);
      if ((int)uVar32 == 0) {
        if (bVar40) {
          return local_5a5;
        }
        uVar104 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar27._4_4_ = uVar104;
        auVar27._0_4_ = uVar104;
        auVar27._8_4_ = uVar104;
        auVar27._12_4_ = uVar104;
        uVar20 = vcmpps_avx512vl(local_3a0,auVar27,2);
        uVar39 = (uint)uVar42 & (uint)uVar42 + 0xf & (uint)uVar20;
        uVar42 = (ulong)uVar39;
        local_5a5 = uVar39 != 0;
        if (!local_5a5) {
          return local_5a5;
        }
        goto LAB_01c26b03;
      }
      uVar31 = (int)uVar32 - 1;
      uVar33 = (ulong)uVar31;
      uVar37 = (&uStack_260)[uVar33 * 2];
      fVar242 = afStack_25c[uVar33 * 2];
      uVar6 = auStack_440[uVar33];
      auVar275._8_8_ = 0;
      auVar275._0_8_ = auStack_1a0[uVar33];
      auVar276 = ZEXT1664(auVar275);
      lVar36 = 0;
      for (uVar35 = (ulong)uVar6; (uVar35 & 1) == 0; uVar35 = uVar35 >> 1 | 0x8000000000000000) {
        lVar36 = lVar36 + 1;
      }
      uVar34 = uVar6 - 1 & uVar6;
      auStack_440[uVar33] = uVar34;
      if (uVar34 == 0) {
        uVar32 = (ulong)uVar31;
      }
      auVar45 = vpxord_avx512vl(auVar280._0_16_,auVar280._0_16_);
      auVar61 = vcvtsi2ss_avx512f(auVar45,lVar36);
      auVar46 = vmulss_avx512f(auVar61,in_ZMM18._0_16_);
      lVar36 = lVar36 + 1;
      auVar61 = vpxord_avx512vl(auVar45,auVar45);
      auVar61 = vcvtsi2ss_avx512f(auVar61,lVar36);
      auVar61 = vmulss_avx512f(auVar61,in_ZMM18._0_16_);
      auVar47 = auVar279._0_16_;
      auVar45 = vsubss_avx512f(auVar47,auVar46);
      auVar46 = vmulss_avx512f(ZEXT416((uint)fVar242),auVar46);
      auVar45 = vfmadd231ss_avx512f(auVar46,ZEXT416(uVar37),auVar45);
      auVar46 = vsubss_avx512f(auVar47,auVar61);
      auVar61 = vfmadd231ss_fma(ZEXT416((uint)(fVar242 * auVar61._0_4_)),ZEXT416(uVar37),auVar46);
      auVar46 = vsubss_avx512f(auVar61,auVar45);
      vucomiss_avx512f(auVar46);
      if (uVar6 == 0 || lVar36 == 0) break;
      auVar280 = ZEXT1664(auVar275);
      auVar48 = vshufps_avx(auVar275,auVar275,0x50);
      vucomiss_avx512f(auVar46);
      uVar37 = (uint)uVar32;
      auVar123._8_4_ = 0x3f800000;
      auVar123._0_8_ = &DAT_3f8000003f800000;
      auVar123._12_4_ = 0x3f800000;
      auVar49 = vsubps_avx(auVar123,auVar48);
      fVar242 = auVar48._0_4_;
      auVar138._0_4_ = fVar242 * fVar130;
      fVar226 = auVar48._4_4_;
      auVar138._4_4_ = fVar226 * fVar129;
      fVar237 = auVar48._8_4_;
      auVar138._8_4_ = fVar237 * fVar130;
      fVar238 = auVar48._12_4_;
      auVar138._12_4_ = fVar238 * fVar129;
      auVar153._0_4_ = fVar242 * fVar146;
      auVar153._4_4_ = fVar226 * fVar147;
      auVar153._8_4_ = fVar237 * fVar146;
      auVar153._12_4_ = fVar238 * fVar147;
      auVar170._0_4_ = fVar242 * fVar225;
      auVar170._4_4_ = fVar226 * fVar236;
      auVar170._8_4_ = fVar237 * fVar225;
      auVar170._12_4_ = fVar238 * fVar236;
      auVar116._0_4_ = fVar242 * fVar148;
      auVar116._4_4_ = fVar226 * fVar187;
      auVar116._8_4_ = fVar237 * fVar148;
      auVar116._12_4_ = fVar238 * fVar187;
      auVar48 = vfmadd231ps_fma(auVar138,auVar49,auVar44);
      auVar50 = vfmadd231ps_fma(auVar153,auVar49,auVar55);
      auVar53 = vfmadd231ps_fma(auVar170,auVar49,auVar207);
      auVar49 = vfmadd231ps_fma(auVar116,auVar49,auVar219);
      auVar128._16_16_ = auVar48;
      auVar128._0_16_ = auVar48;
      auVar144._16_16_ = auVar50;
      auVar144._0_16_ = auVar50;
      auVar157._16_16_ = auVar53;
      auVar157._0_16_ = auVar53;
      auVar48 = vbroadcastss_avx512vl(auVar45);
      uVar104 = auVar61._0_4_;
      auVar186._20_4_ = uVar104;
      auVar186._16_4_ = uVar104;
      auVar186._24_4_ = uVar104;
      auVar186._28_4_ = uVar104;
      auVar186._0_16_ = auVar48;
      auVar88 = vsubps_avx(auVar144,auVar128);
      auVar50 = vfmadd213ps_fma(auVar88,auVar186,auVar128);
      auVar88 = vsubps_avx(auVar157,auVar144);
      auVar54 = vfmadd213ps_fma(auVar88,auVar186,auVar144);
      auVar48 = vsubps_avx(auVar49,auVar53);
      auVar145._16_16_ = auVar48;
      auVar145._0_16_ = auVar48;
      auVar48 = vfmadd213ps_fma(auVar145,auVar186,auVar157);
      auVar88 = vsubps_avx(ZEXT1632(auVar54),ZEXT1632(auVar50));
      auVar49 = vfmadd213ps_fma(auVar88,auVar186,ZEXT1632(auVar50));
      auVar88 = vsubps_avx(ZEXT1632(auVar48),ZEXT1632(auVar54));
      auVar48 = vfmadd213ps_fma(auVar88,auVar186,ZEXT1632(auVar54));
      auVar88 = vsubps_avx(ZEXT1632(auVar48),ZEXT1632(auVar49));
      auVar159 = vfmadd231ps_fma(ZEXT1632(auVar49),auVar88,auVar186);
      auVar88 = vmulps_avx512vl(auVar88,in_ZMM17._0_32_);
      auVar82._16_16_ = auVar88._16_16_;
      auVar48 = vmulss_avx512f(auVar46,SUB6416(ZEXT464(0x3eaaaaab),0));
      fVar242 = auVar48._0_4_;
      auVar171._0_8_ =
           CONCAT44(auVar159._4_4_ + fVar242 * auVar88._4_4_,
                    auVar159._0_4_ + fVar242 * auVar88._0_4_);
      auVar171._8_4_ = auVar159._8_4_ + fVar242 * auVar88._8_4_;
      auVar171._12_4_ = auVar159._12_4_ + fVar242 * auVar88._12_4_;
      auVar139._0_4_ = fVar242 * auVar88._16_4_;
      auVar139._4_4_ = fVar242 * auVar88._20_4_;
      auVar139._8_4_ = fVar242 * auVar88._24_4_;
      auVar139._12_4_ = fVar242 * auVar88._28_4_;
      auVar150 = vsubps_avx((undefined1  [16])0x0,auVar139);
      auVar67 = vshufpd_avx(auVar159,auVar159,3);
      auVar68 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar48 = vsubps_avx(auVar67,auVar159);
      auVar49 = vsubps_avx(auVar68,(undefined1  [16])0x0);
      auVar191._0_4_ = auVar49._0_4_ + auVar48._0_4_;
      auVar191._4_4_ = auVar49._4_4_ + auVar48._4_4_;
      auVar191._8_4_ = auVar49._8_4_ + auVar48._8_4_;
      auVar191._12_4_ = auVar49._12_4_ + auVar48._12_4_;
      auVar48 = vshufps_avx(auVar159,auVar159,0xb1);
      auVar49 = vshufps_avx(auVar171,auVar171,0xb1);
      auVar50 = vshufps_avx(auVar150,auVar150,0xb1);
      auVar53 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar253._4_4_ = auVar191._0_4_;
      auVar253._0_4_ = auVar191._0_4_;
      auVar253._8_4_ = auVar191._0_4_;
      auVar253._12_4_ = auVar191._0_4_;
      auVar54 = vshufps_avx(auVar191,auVar191,0x55);
      fVar242 = auVar54._0_4_;
      auVar208._0_4_ = auVar48._0_4_ * fVar242;
      fVar226 = auVar54._4_4_;
      auVar208._4_4_ = auVar48._4_4_ * fVar226;
      fVar237 = auVar54._8_4_;
      auVar208._8_4_ = auVar48._8_4_ * fVar237;
      fVar238 = auVar54._12_4_;
      auVar208._12_4_ = auVar48._12_4_ * fVar238;
      auVar220._0_4_ = auVar49._0_4_ * fVar242;
      auVar220._4_4_ = auVar49._4_4_ * fVar226;
      auVar220._8_4_ = auVar49._8_4_ * fVar237;
      auVar220._12_4_ = auVar49._12_4_ * fVar238;
      auVar228._0_4_ = auVar50._0_4_ * fVar242;
      auVar228._4_4_ = auVar50._4_4_ * fVar226;
      auVar228._8_4_ = auVar50._8_4_ * fVar237;
      auVar228._12_4_ = auVar50._12_4_ * fVar238;
      auVar192._0_4_ = auVar53._0_4_ * fVar242;
      auVar192._4_4_ = auVar53._4_4_ * fVar226;
      auVar192._8_4_ = auVar53._8_4_ * fVar237;
      auVar192._12_4_ = auVar53._12_4_ * fVar238;
      auVar48 = vfmadd231ps_fma(auVar208,auVar253,auVar159);
      auVar49 = vfmadd231ps_fma(auVar220,auVar253,auVar171);
      auVar54 = vfmadd231ps_fma(auVar228,auVar253,auVar150);
      auVar69 = vfmadd231ps_fma(auVar192,(undefined1  [16])0x0,auVar253);
      auVar109 = vshufpd_avx(auVar48,auVar48,1);
      auVar65 = vshufpd_avx(auVar49,auVar49,1);
      auVar66 = vshufpd_avx(auVar54,auVar54,1);
      auVar149 = vshufpd_avx(auVar69,auVar69,1);
      auVar50 = vminss_avx(auVar48,auVar49);
      auVar48 = vmaxss_avx(auVar49,auVar48);
      auVar53 = vminss_avx(auVar54,auVar69);
      auVar49 = vmaxss_avx(auVar69,auVar54);
      auVar53 = vminss_avx(auVar50,auVar53);
      auVar48 = vmaxss_avx(auVar49,auVar48);
      auVar54 = vminss_avx(auVar109,auVar65);
      auVar49 = vmaxss_avx(auVar65,auVar109);
      auVar109 = vminss_avx(auVar66,auVar149);
      auVar50 = vmaxss_avx(auVar149,auVar66);
      auVar54 = vminss_avx(auVar54,auVar109);
      auVar49 = vmaxss_avx(auVar50,auVar49);
      auVar50 = vucomiss_avx512f(auVar53);
      in_ZMM22 = ZEXT1664(auVar50);
      if ((uVar37 < 5) || (auVar49 = vucomiss_avx512f(auVar43), uVar37 < 5)) {
        auVar48 = vucomiss_avx512f(auVar43);
        uVar20 = vcmpps_avx512vl(auVar54,auVar57,1);
        uVar21 = vcmpps_avx512vl(auVar53,auVar57,1);
        if ((4 < uVar37 & ((byte)uVar21 | (byte)uVar20)) != 0) goto LAB_01c27dbf;
        uVar20 = vcmpps_avx512vl(auVar43,auVar49,5);
        uVar21 = vcmpps_avx512vl(auVar54,auVar57,5);
        if ((((ushort)uVar21 | (ushort)uVar20) & 1) == 0) goto LAB_01c27dbf;
        bVar22 = true;
        auVar276 = ZEXT1664(auVar275);
      }
      else {
LAB_01c27dbf:
        uVar20 = vcmpss_avx512f(auVar53,auVar60,1);
        bVar22 = (bool)((byte)uVar20 & 1);
        iVar102 = auVar279._0_4_;
        fVar242 = (float)((uint)bVar22 * -0x40800000 + (uint)!bVar22 * iVar102);
        uVar20 = vcmpss_avx512f(auVar48,auVar60,1);
        bVar22 = (bool)((byte)uVar20 & 1);
        fVar226 = (float)((uint)bVar22 * -0x40800000 + (uint)!bVar22 * iVar102);
        bVar22 = fVar242 != fVar226;
        iVar281 = auVar282._0_4_;
        auVar82._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar91._4_28_ = auVar82._4_28_;
        auVar91._0_4_ = (uint)bVar22 * iVar281 + (uint)!bVar22 * 0x7f800000;
        auVar57 = auVar91._0_16_;
        auVar93._16_16_ = auVar82._16_16_;
        auVar93._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar92._4_28_ = auVar93._4_28_;
        auVar92._0_4_ = (uint)bVar22 * iVar281 + (uint)!bVar22 * -0x800000;
        auVar43 = auVar92._0_16_;
        uVar20 = vcmpss_avx512f(auVar54,auVar60,1);
        bVar22 = (bool)((byte)uVar20 & 1);
        fVar237 = (float)((uint)bVar22 * -0x40800000 + (uint)!bVar22 * iVar102);
        if ((fVar242 != fVar237) || (NAN(fVar242) || NAN(fVar237))) {
          fVar238 = auVar54._0_4_;
          fVar242 = auVar53._0_4_;
          bVar22 = fVar238 == fVar242;
          if ((!bVar22) || (NAN(fVar238) || NAN(fVar242))) {
            auVar26._8_4_ = 0x80000000;
            auVar26._0_8_ = 0x8000000080000000;
            auVar26._12_4_ = 0x80000000;
            auVar50 = vxorps_avx512vl(auVar53,auVar26);
            auVar267._0_4_ = auVar50._0_4_ / (fVar238 - fVar242);
            auVar267._4_12_ = auVar50._4_12_;
            auVar50 = vsubss_avx512f(auVar47,auVar267);
            auVar53 = vfmadd213ss_avx512f(auVar50,auVar60,auVar267);
            auVar50 = auVar53;
          }
          else {
            vucomiss_avx512f(auVar60);
            auVar95._16_16_ = auVar82._16_16_;
            auVar95._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar94._4_28_ = auVar95._4_28_;
            auVar94._0_4_ = (uint)bVar22 * iVar281 + (uint)!bVar22 * 0x7f800000;
            auVar53 = auVar94._0_16_;
            auVar50 = ZEXT416((uint)bVar22 * 0x3f800000 + (uint)!bVar22 * -0x800000);
          }
          auVar57 = vminss_avx(auVar57,auVar53);
          auVar43 = vmaxss_avx(auVar50,auVar43);
        }
        auVar276 = ZEXT1664(auVar275);
        uVar20 = vcmpss_avx512f(auVar49,auVar60,1);
        bVar22 = (bool)((byte)uVar20 & 1);
        fVar242 = (float)((uint)bVar22 * -0x40800000 + (uint)!bVar22 * iVar102);
        if ((fVar226 != fVar242) || (NAN(fVar226) || NAN(fVar242))) {
          fVar238 = auVar49._0_4_;
          fVar226 = auVar48._0_4_;
          bVar22 = fVar238 == fVar226;
          if ((!bVar22) || (NAN(fVar238) || NAN(fVar226))) {
            auVar25._8_4_ = 0x80000000;
            auVar25._0_8_ = 0x8000000080000000;
            auVar25._12_4_ = 0x80000000;
            auVar48 = vxorps_avx512vl(auVar48,auVar25);
            auVar229._0_4_ = auVar48._0_4_ / (fVar238 - fVar226);
            auVar229._4_12_ = auVar48._4_12_;
            auVar48 = vsubss_avx512f(auVar47,auVar229);
            auVar49 = vfmadd213ss_avx512f(auVar48,auVar60,auVar229);
            auVar48 = auVar49;
          }
          else {
            vucomiss_avx512f(auVar60);
            auVar97._16_16_ = auVar82._16_16_;
            auVar97._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar96._4_28_ = auVar97._4_28_;
            auVar96._0_4_ = (uint)bVar22 * iVar281 + (uint)!bVar22 * 0x7f800000;
            auVar49 = auVar96._0_16_;
            auVar48 = ZEXT416((uint)bVar22 * 0x3f800000 + (uint)!bVar22 * -0x800000);
          }
          auVar57 = vminss_avx(auVar57,auVar49);
          auVar43 = vmaxss_avx(auVar48,auVar43);
        }
        bVar22 = fVar237 != fVar242;
        auVar48 = vminss_avx512f(auVar57,auVar47);
        auVar99._16_16_ = auVar82._16_16_;
        auVar99._0_16_ = auVar57;
        auVar98._4_28_ = auVar99._4_28_;
        auVar98._0_4_ = (uint)bVar22 * auVar48._0_4_ + (uint)!bVar22 * auVar57._0_4_;
        auVar57 = vmaxss_avx512f(auVar47,auVar43);
        auVar101._16_16_ = auVar82._16_16_;
        auVar101._0_16_ = auVar43;
        auVar100._4_28_ = auVar101._4_28_;
        auVar100._0_4_ = (uint)bVar22 * auVar57._0_4_ + (uint)!bVar22 * auVar43._0_4_;
        auVar43 = vmaxss_avx512f(auVar60,auVar98._0_16_);
        auVar57 = vminss_avx512f(auVar100._0_16_,auVar47);
        bVar22 = true;
        if (auVar43._0_4_ <= auVar57._0_4_) {
          auVar65 = vmaxss_avx512f(auVar60,ZEXT416((uint)(auVar43._0_4_ + -0.1)));
          auVar66 = vminss_avx512f(ZEXT416((uint)(auVar57._0_4_ + 0.1)),auVar47);
          auVar117._0_8_ = auVar159._0_8_;
          auVar117._8_8_ = auVar117._0_8_;
          auVar221._8_8_ = auVar171._0_8_;
          auVar221._0_8_ = auVar171._0_8_;
          auVar230._8_8_ = auVar150._0_8_;
          auVar230._0_8_ = auVar150._0_8_;
          auVar43 = vshufpd_avx(auVar171,auVar171,3);
          auVar57 = vshufpd_avx(auVar150,auVar150,3);
          auVar48 = vshufps_avx(auVar65,auVar66,0);
          auVar254._8_4_ = 0x3f800000;
          auVar254._0_8_ = &DAT_3f8000003f800000;
          auVar254._12_4_ = 0x3f800000;
          auVar49 = vsubps_avx(auVar254,auVar48);
          fVar242 = auVar48._0_4_;
          auVar261._0_4_ = fVar242 * auVar67._0_4_;
          fVar226 = auVar48._4_4_;
          auVar261._4_4_ = fVar226 * auVar67._4_4_;
          fVar237 = auVar48._8_4_;
          auVar261._8_4_ = fVar237 * auVar67._8_4_;
          fVar238 = auVar48._12_4_;
          auVar261._12_4_ = fVar238 * auVar67._12_4_;
          auVar172._0_4_ = fVar242 * auVar43._0_4_;
          auVar172._4_4_ = fVar226 * auVar43._4_4_;
          auVar172._8_4_ = fVar237 * auVar43._8_4_;
          auVar172._12_4_ = fVar238 * auVar43._12_4_;
          auVar183._0_4_ = fVar242 * auVar57._0_4_;
          auVar183._4_4_ = fVar226 * auVar57._4_4_;
          auVar183._8_4_ = fVar237 * auVar57._8_4_;
          auVar183._12_4_ = fVar238 * auVar57._12_4_;
          auVar140._0_4_ = fVar242 * auVar68._0_4_;
          auVar140._4_4_ = fVar226 * auVar68._4_4_;
          auVar140._8_4_ = fVar237 * auVar68._8_4_;
          auVar140._12_4_ = fVar238 * auVar68._12_4_;
          auVar50 = vfmadd231ps_fma(auVar261,auVar49,auVar117);
          auVar53 = vfmadd231ps_fma(auVar172,auVar49,auVar221);
          auVar54 = vfmadd231ps_fma(auVar183,auVar49,auVar230);
          auVar109 = vfmadd231ps_fma(auVar140,auVar49,ZEXT816(0));
          auVar57 = vsubss_avx512f(auVar47,auVar65);
          auVar43 = vmovshdup_avx(auVar275);
          auVar149 = vfmadd231ss_fma(ZEXT416((uint)(auVar43._0_4_ * auVar65._0_4_)),auVar275,auVar57
                                    );
          auVar57 = vsubss_avx512f(auVar47,auVar66);
          auVar150 = vfmadd231ss_fma(ZEXT416((uint)(auVar66._0_4_ * auVar43._0_4_)),auVar275,auVar57
                                    );
          auVar49 = vdivss_avx512f(auVar47,auVar46);
          auVar43 = vsubps_avx(auVar53,auVar50);
          auVar46 = vmulps_avx512vl(auVar43,auVar59);
          auVar43 = vsubps_avx(auVar54,auVar53);
          auVar48 = vmulps_avx512vl(auVar43,auVar59);
          auVar43 = vsubps_avx(auVar109,auVar54);
          auVar43 = vmulps_avx512vl(auVar43,auVar59);
          auVar57 = vminps_avx(auVar48,auVar43);
          auVar43 = vmaxps_avx(auVar48,auVar43);
          auVar57 = vminps_avx(auVar46,auVar57);
          auVar43 = vmaxps_avx(auVar46,auVar43);
          auVar46 = vshufpd_avx(auVar57,auVar57,3);
          auVar48 = vshufpd_avx(auVar43,auVar43,3);
          auVar57 = vminps_avx(auVar57,auVar46);
          auVar43 = vmaxps_avx(auVar43,auVar48);
          fVar242 = auVar49._0_4_;
          auVar209._0_4_ = fVar242 * auVar57._0_4_;
          auVar209._4_4_ = fVar242 * auVar57._4_4_;
          auVar209._8_4_ = fVar242 * auVar57._8_4_;
          auVar209._12_4_ = fVar242 * auVar57._12_4_;
          auVar193._0_4_ = fVar242 * auVar43._0_4_;
          auVar193._4_4_ = fVar242 * auVar43._4_4_;
          auVar193._8_4_ = fVar242 * auVar43._8_4_;
          auVar193._12_4_ = fVar242 * auVar43._12_4_;
          auVar67 = vdivss_avx512f(auVar47,ZEXT416((uint)(auVar150._0_4_ - auVar149._0_4_)));
          auVar43 = vshufpd_avx(auVar50,auVar50,3);
          auVar57 = vshufpd_avx(auVar53,auVar53,3);
          auVar46 = vshufpd_avx(auVar54,auVar54,3);
          auVar48 = vshufpd_avx(auVar109,auVar109,3);
          auVar43 = vsubps_avx(auVar43,auVar50);
          auVar49 = vsubps_avx(auVar57,auVar53);
          auVar50 = vsubps_avx(auVar46,auVar54);
          auVar48 = vsubps_avx(auVar48,auVar109);
          auVar57 = vminps_avx(auVar43,auVar49);
          auVar43 = vmaxps_avx(auVar43,auVar49);
          auVar46 = vminps_avx(auVar50,auVar48);
          auVar46 = vminps_avx(auVar57,auVar46);
          auVar57 = vmaxps_avx(auVar50,auVar48);
          auVar43 = vmaxps_avx(auVar43,auVar57);
          fVar242 = auVar67._0_4_;
          auVar231._0_4_ = fVar242 * auVar46._0_4_;
          auVar231._4_4_ = fVar242 * auVar46._4_4_;
          auVar231._8_4_ = fVar242 * auVar46._8_4_;
          auVar231._12_4_ = fVar242 * auVar46._12_4_;
          auVar244._0_4_ = fVar242 * auVar43._0_4_;
          auVar244._4_4_ = fVar242 * auVar43._4_4_;
          auVar244._8_4_ = fVar242 * auVar43._8_4_;
          auVar244._12_4_ = fVar242 * auVar43._12_4_;
          auVar66 = vinsertps_avx512f(auVar45,auVar149,0x10);
          auVar49 = vinsertps_avx(auVar61,auVar150,0x10);
          auVar107._0_4_ = auVar66._0_4_ + auVar49._0_4_;
          auVar107._4_4_ = auVar66._4_4_ + auVar49._4_4_;
          auVar107._8_4_ = auVar66._8_4_ + auVar49._8_4_;
          auVar107._12_4_ = auVar66._12_4_ + auVar49._12_4_;
          auVar24._8_4_ = 0x3f000000;
          auVar24._0_8_ = 0x3f0000003f000000;
          auVar24._12_4_ = 0x3f000000;
          auVar68 = vmulps_avx512vl(auVar107,auVar24);
          auVar46 = vshufps_avx(auVar68,auVar68,0x54);
          uVar104 = auVar68._0_4_;
          auVar124._4_4_ = uVar104;
          auVar124._0_4_ = uVar104;
          auVar124._8_4_ = uVar104;
          auVar124._12_4_ = uVar104;
          auVar48 = vfmadd213ps_avx512vl(local_270,auVar124,auVar56);
          auVar50 = vfmadd213ps_avx512vl(local_280,auVar124,auVar52);
          auVar57 = vfmadd213ps_fma(local_290,auVar124,auVar51);
          auVar43 = vsubps_avx(auVar50,auVar48);
          auVar48 = vfmadd213ps_fma(auVar43,auVar124,auVar48);
          auVar43 = vsubps_avx(auVar57,auVar50);
          auVar43 = vfmadd213ps_fma(auVar43,auVar124,auVar50);
          auVar43 = vsubps_avx(auVar43,auVar48);
          auVar57 = vfmadd231ps_fma(auVar48,auVar43,auVar124);
          auVar53 = vmulps_avx512vl(auVar43,auVar59);
          auVar255._8_8_ = auVar57._0_8_;
          auVar255._0_8_ = auVar57._0_8_;
          auVar43 = vshufpd_avx(auVar57,auVar57,3);
          auVar57 = vshufps_avx(auVar68,auVar68,0x55);
          auVar48 = vsubps_avx(auVar43,auVar255);
          auVar50 = vfmadd231ps_fma(auVar255,auVar57,auVar48);
          auVar268._8_8_ = auVar53._0_8_;
          auVar268._0_8_ = auVar53._0_8_;
          auVar43 = vshufpd_avx(auVar53,auVar53,3);
          auVar43 = vsubps_avx(auVar43,auVar268);
          auVar57 = vfmadd213ps_fma(auVar43,auVar57,auVar268);
          auVar125._0_8_ = auVar48._0_8_ ^ 0x8000000080000000;
          auVar125._8_4_ = auVar48._8_4_ ^ 0x80000000;
          auVar125._12_4_ = auVar48._12_4_ ^ 0x80000000;
          auVar43 = vmovshdup_avx(auVar57);
          auVar269._0_8_ = auVar43._0_8_ ^ 0x8000000080000000;
          auVar269._8_4_ = auVar43._8_4_ ^ 0x80000000;
          auVar269._12_4_ = auVar43._12_4_ ^ 0x80000000;
          auVar53 = vmovshdup_avx512vl(auVar48);
          auVar54 = vpermt2ps_avx512vl(auVar269,ZEXT416(5),auVar48);
          auVar43 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar43._0_4_ * auVar48._0_4_)),auVar57,
                                        auVar53);
          auVar57 = vpermt2ps_avx512vl(auVar57,SUB6416(ZEXT464(4),0),auVar125);
          auVar141._0_4_ = auVar43._0_4_;
          auVar141._4_4_ = auVar141._0_4_;
          auVar141._8_4_ = auVar141._0_4_;
          auVar141._12_4_ = auVar141._0_4_;
          auVar43 = vdivps_avx(auVar54,auVar141);
          auVar57 = vdivps_avx(auVar57,auVar141);
          fVar226 = auVar50._0_4_;
          auVar48 = vshufps_avx(auVar50,auVar50,0x55);
          fVar242 = auVar57._0_4_;
          auVar256._0_4_ = fVar226 * auVar43._0_4_ + auVar48._0_4_ * fVar242;
          auVar256._4_4_ = fVar226 * auVar43._4_4_ + auVar48._4_4_ * auVar57._4_4_;
          auVar256._8_4_ = fVar226 * auVar43._8_4_ + auVar48._8_4_ * auVar57._8_4_;
          auVar256._12_4_ = fVar226 * auVar43._12_4_ + auVar48._12_4_ * auVar57._12_4_;
          auVar65 = vsubps_avx(auVar46,auVar256);
          auVar50 = vmovshdup_avx(auVar43);
          auVar46 = vinsertps_avx(auVar209,auVar231,0x1c);
          auVar270._0_4_ = auVar50._0_4_ * auVar46._0_4_;
          auVar270._4_4_ = auVar50._4_4_ * auVar46._4_4_;
          auVar270._8_4_ = auVar50._8_4_ * auVar46._8_4_;
          auVar270._12_4_ = auVar50._12_4_ * auVar46._12_4_;
          auVar48 = vinsertps_avx(auVar193,auVar244,0x1c);
          auVar257._0_4_ = auVar50._0_4_ * auVar48._0_4_;
          auVar257._4_4_ = auVar50._4_4_ * auVar48._4_4_;
          auVar257._8_4_ = auVar50._8_4_ * auVar48._8_4_;
          auVar257._12_4_ = auVar50._12_4_ * auVar48._12_4_;
          auVar67 = vminps_avx512vl(auVar270,auVar257);
          auVar54 = vmaxps_avx(auVar257,auVar270);
          auVar109 = vmovshdup_avx(auVar57);
          auVar50 = vinsertps_avx(auVar231,auVar209,0x4c);
          auVar232._0_4_ = auVar109._0_4_ * auVar50._0_4_;
          auVar232._4_4_ = auVar109._4_4_ * auVar50._4_4_;
          auVar232._8_4_ = auVar109._8_4_ * auVar50._8_4_;
          auVar232._12_4_ = auVar109._12_4_ * auVar50._12_4_;
          auVar53 = vinsertps_avx(auVar244,auVar193,0x4c);
          auVar245._0_4_ = auVar109._0_4_ * auVar53._0_4_;
          auVar245._4_4_ = auVar109._4_4_ * auVar53._4_4_;
          auVar245._8_4_ = auVar109._8_4_ * auVar53._8_4_;
          auVar245._12_4_ = auVar109._12_4_ * auVar53._12_4_;
          auVar109 = vminps_avx(auVar232,auVar245);
          auVar67 = vaddps_avx512vl(auVar67,auVar109);
          auVar109 = vmaxps_avx(auVar245,auVar232);
          auVar233._0_4_ = auVar54._0_4_ + auVar109._0_4_;
          auVar233._4_4_ = auVar54._4_4_ + auVar109._4_4_;
          auVar233._8_4_ = auVar54._8_4_ + auVar109._8_4_;
          auVar233._12_4_ = auVar54._12_4_ + auVar109._12_4_;
          auVar246._8_8_ = 0x3f80000000000000;
          auVar246._0_8_ = 0x3f80000000000000;
          auVar54 = vsubps_avx(auVar246,auVar233);
          auVar109 = vsubps_avx(auVar246,auVar67);
          auVar67 = vsubps_avx(auVar66,auVar68);
          auVar68 = vsubps_avx(auVar49,auVar68);
          fVar240 = auVar67._0_4_;
          auVar271._0_4_ = fVar240 * auVar54._0_4_;
          fVar241 = auVar67._4_4_;
          auVar271._4_4_ = fVar241 * auVar54._4_4_;
          fVar201 = auVar67._8_4_;
          auVar271._8_4_ = fVar201 * auVar54._8_4_;
          fVar202 = auVar67._12_4_;
          auVar271._12_4_ = fVar202 * auVar54._12_4_;
          auVar69 = vbroadcastss_avx512vl(auVar43);
          auVar46 = vmulps_avx512vl(auVar69,auVar46);
          auVar48 = vmulps_avx512vl(auVar69,auVar48);
          auVar69 = vminps_avx512vl(auVar46,auVar48);
          auVar46 = vmaxps_avx(auVar48,auVar46);
          auVar210._0_4_ = fVar242 * auVar50._0_4_;
          auVar210._4_4_ = fVar242 * auVar50._4_4_;
          auVar210._8_4_ = fVar242 * auVar50._8_4_;
          auVar210._12_4_ = fVar242 * auVar50._12_4_;
          auVar194._0_4_ = fVar242 * auVar53._0_4_;
          auVar194._4_4_ = fVar242 * auVar53._4_4_;
          auVar194._8_4_ = fVar242 * auVar53._8_4_;
          auVar194._12_4_ = fVar242 * auVar53._12_4_;
          auVar48 = vminps_avx(auVar210,auVar194);
          auVar50 = vaddps_avx512vl(auVar69,auVar48);
          auVar53 = vmulps_avx512vl(auVar67,auVar109);
          fVar226 = auVar68._0_4_;
          auVar234._0_4_ = fVar226 * auVar54._0_4_;
          fVar237 = auVar68._4_4_;
          auVar234._4_4_ = fVar237 * auVar54._4_4_;
          fVar238 = auVar68._8_4_;
          auVar234._8_4_ = fVar238 * auVar54._8_4_;
          fVar239 = auVar68._12_4_;
          auVar234._12_4_ = fVar239 * auVar54._12_4_;
          auVar247._0_4_ = fVar226 * auVar109._0_4_;
          auVar247._4_4_ = fVar237 * auVar109._4_4_;
          auVar247._8_4_ = fVar238 * auVar109._8_4_;
          auVar247._12_4_ = fVar239 * auVar109._12_4_;
          auVar48 = vmaxps_avx(auVar194,auVar210);
          auVar195._0_4_ = auVar46._0_4_ + auVar48._0_4_;
          auVar195._4_4_ = auVar46._4_4_ + auVar48._4_4_;
          auVar195._8_4_ = auVar46._8_4_ + auVar48._8_4_;
          auVar195._12_4_ = auVar46._12_4_ + auVar48._12_4_;
          auVar211._8_8_ = 0x3f800000;
          auVar211._0_8_ = 0x3f800000;
          auVar46 = vsubps_avx(auVar211,auVar195);
          auVar48 = vsubps_avx(auVar211,auVar50);
          auVar262._0_4_ = fVar240 * auVar46._0_4_;
          auVar262._4_4_ = fVar241 * auVar46._4_4_;
          auVar262._8_4_ = fVar201 * auVar46._8_4_;
          auVar262._12_4_ = fVar202 * auVar46._12_4_;
          auVar258._0_4_ = fVar240 * auVar48._0_4_;
          auVar258._4_4_ = fVar241 * auVar48._4_4_;
          auVar258._8_4_ = fVar201 * auVar48._8_4_;
          auVar258._12_4_ = fVar202 * auVar48._12_4_;
          auVar196._0_4_ = fVar226 * auVar46._0_4_;
          auVar196._4_4_ = fVar237 * auVar46._4_4_;
          auVar196._8_4_ = fVar238 * auVar46._8_4_;
          auVar196._12_4_ = fVar239 * auVar46._12_4_;
          auVar212._0_4_ = fVar226 * auVar48._0_4_;
          auVar212._4_4_ = fVar237 * auVar48._4_4_;
          auVar212._8_4_ = fVar238 * auVar48._8_4_;
          auVar212._12_4_ = fVar239 * auVar48._12_4_;
          auVar46 = vminps_avx(auVar262,auVar258);
          auVar48 = vminps_avx(auVar196,auVar212);
          auVar50 = vminps_avx(auVar46,auVar48);
          auVar46 = vmaxps_avx(auVar258,auVar262);
          auVar48 = vmaxps_avx(auVar212,auVar196);
          auVar48 = vmaxps_avx(auVar48,auVar46);
          auVar54 = vminps_avx512vl(auVar271,auVar53);
          auVar46 = vminps_avx(auVar234,auVar247);
          auVar46 = vminps_avx(auVar54,auVar46);
          auVar46 = vhaddps_avx(auVar50,auVar46);
          auVar53 = vmaxps_avx512vl(auVar53,auVar271);
          auVar50 = vmaxps_avx(auVar247,auVar234);
          auVar50 = vmaxps_avx(auVar50,auVar53);
          auVar48 = vhaddps_avx(auVar48,auVar50);
          auVar46 = vshufps_avx(auVar46,auVar46,0xe8);
          auVar48 = vshufps_avx(auVar48,auVar48,0xe8);
          auVar197._0_4_ = auVar46._0_4_ + auVar65._0_4_;
          auVar197._4_4_ = auVar46._4_4_ + auVar65._4_4_;
          auVar197._8_4_ = auVar46._8_4_ + auVar65._8_4_;
          auVar197._12_4_ = auVar46._12_4_ + auVar65._12_4_;
          auVar213._0_4_ = auVar48._0_4_ + auVar65._0_4_;
          auVar213._4_4_ = auVar48._4_4_ + auVar65._4_4_;
          auVar213._8_4_ = auVar48._8_4_ + auVar65._8_4_;
          auVar213._12_4_ = auVar48._12_4_ + auVar65._12_4_;
          auVar46 = vmaxps_avx(auVar66,auVar197);
          auVar48 = vminps_avx(auVar213,auVar49);
          uVar35 = vcmpps_avx512vl(auVar48,auVar46,1);
          auVar46 = vinsertps_avx(auVar149,auVar150,0x10);
          auVar276 = ZEXT1664(auVar46);
          if ((uVar35 & 3) == 0) {
            vucomiss_avx512f(auVar45);
            local_4d0 = auVar58._0_4_;
            fStack_4cc = auVar58._4_4_;
            fStack_4c8 = auVar58._8_4_;
            fStack_4c4 = auVar58._12_4_;
            if (uVar37 < 4 && (uVar6 == 0 || lVar36 == 0)) {
              bVar22 = false;
            }
            else {
              lVar36 = 200;
              do {
                auVar48 = vsubss_avx512f(auVar47,auVar65);
                fVar238 = auVar48._0_4_;
                fVar226 = fVar238 * fVar238 * fVar238;
                fVar239 = auVar65._0_4_;
                fVar237 = fVar239 * 3.0 * fVar238 * fVar238;
                fVar238 = fVar238 * fVar239 * fVar239 * 3.0;
                auVar173._4_4_ = fVar226;
                auVar173._0_4_ = fVar226;
                auVar173._8_4_ = fVar226;
                auVar173._12_4_ = fVar226;
                auVar154._4_4_ = fVar237;
                auVar154._0_4_ = fVar237;
                auVar154._8_4_ = fVar237;
                auVar154._12_4_ = fVar237;
                auVar118._4_4_ = fVar238;
                auVar118._0_4_ = fVar238;
                auVar118._8_4_ = fVar238;
                auVar118._12_4_ = fVar238;
                fVar239 = fVar239 * fVar239 * fVar239;
                auVar184._0_4_ = local_4d0 * fVar239;
                auVar184._4_4_ = fStack_4cc * fVar239;
                auVar184._8_4_ = fStack_4c8 * fVar239;
                auVar184._12_4_ = fStack_4c4 * fVar239;
                auVar48 = vfmadd231ps_fma(auVar184,auVar51,auVar118);
                auVar48 = vfmadd231ps_avx512vl(auVar48,auVar52,auVar154);
                auVar48 = vfmadd231ps_avx512vl(auVar48,auVar56,auVar173);
                auVar119._8_8_ = auVar48._0_8_;
                auVar119._0_8_ = auVar48._0_8_;
                auVar48 = vshufpd_avx(auVar48,auVar48,3);
                auVar49 = vshufps_avx(auVar65,auVar65,0x55);
                auVar48 = vsubps_avx(auVar48,auVar119);
                auVar49 = vfmadd213ps_fma(auVar48,auVar49,auVar119);
                fVar226 = auVar49._0_4_;
                auVar48 = vshufps_avx(auVar49,auVar49,0x55);
                auVar120._0_4_ = auVar43._0_4_ * fVar226 + fVar242 * auVar48._0_4_;
                auVar120._4_4_ = auVar43._4_4_ * fVar226 + auVar57._4_4_ * auVar48._4_4_;
                auVar120._8_4_ = auVar43._8_4_ * fVar226 + auVar57._8_4_ * auVar48._8_4_;
                auVar120._12_4_ = auVar43._12_4_ * fVar226 + auVar57._12_4_ * auVar48._12_4_;
                auVar65 = vsubps_avx(auVar65,auVar120);
                auVar48 = vandps_avx512vl(auVar49,auVar278._0_16_);
                auVar49 = vprolq_avx512vl(auVar48,0x20);
                auVar48 = vmaxss_avx(auVar49,auVar48);
                bVar41 = auVar48._0_4_ <= fVar108;
                if (auVar48._0_4_ < fVar108) {
                  auVar43 = vucomiss_avx512f(auVar60);
                  if (bVar41) {
                    auVar57 = vucomiss_avx512f(auVar43);
                    auVar279 = ZEXT1664(auVar57);
                    if (bVar41) {
                      vmovshdup_avx(auVar43);
                      auVar57 = vucomiss_avx512f(auVar60);
                      if (bVar41) {
                        auVar47 = vucomiss_avx512f(auVar57);
                        auVar279 = ZEXT1664(auVar47);
                        if (bVar41) {
                          auVar48 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]
                                                         ),ZEXT416((uint)pre->ray_space[k].vy.
                                                                         field_0.m128[2]),0x1c);
                          auVar68 = vinsertps_avx(auVar48,ZEXT416((uint)pre->ray_space[k].vz.field_0
                                                                        .m128[2]),0x28);
                          auVar48 = vdpps_avx(auVar68,local_2a0,0x7f);
                          auVar49 = vdpps_avx(auVar68,local_2b0,0x7f);
                          auVar50 = vdpps_avx(auVar68,local_2c0,0x7f);
                          auVar53 = vdpps_avx(auVar68,local_2d0,0x7f);
                          auVar54 = vdpps_avx(auVar68,local_2e0,0x7f);
                          auVar109 = vdpps_avx(auVar68,local_2f0,0x7f);
                          auVar67 = vdpps_avx(auVar68,local_300,0x7f);
                          auVar68 = vdpps_avx(auVar68,local_310,0x7f);
                          auVar65 = vsubss_avx512f(auVar47,auVar57);
                          fVar242 = auVar57._0_4_;
                          auVar57 = vfmadd231ss_fma(ZEXT416((uint)(fVar242 * auVar54._0_4_)),auVar65
                                                    ,auVar48);
                          auVar48 = vfmadd231ss_fma(ZEXT416((uint)(auVar109._0_4_ * fVar242)),
                                                    auVar65,auVar49);
                          auVar49 = vfmadd231ss_fma(ZEXT416((uint)(auVar67._0_4_ * fVar242)),auVar65
                                                    ,auVar50);
                          auVar50 = vfmadd231ss_fma(ZEXT416((uint)(fVar242 * auVar68._0_4_)),auVar65
                                                    ,auVar53);
                          auVar47 = vsubss_avx512f(auVar47,auVar43);
                          auVar185._0_4_ = auVar47._0_4_;
                          fVar242 = auVar185._0_4_ * auVar185._0_4_ * auVar185._0_4_;
                          local_120 = auVar43._0_4_;
                          fVar226 = local_120 * 3.0 * auVar185._0_4_ * auVar185._0_4_;
                          fVar237 = auVar185._0_4_ * local_120 * local_120 * 3.0;
                          fVar239 = local_120 * local_120 * local_120;
                          auVar47 = vfmadd231ss_fma(ZEXT416((uint)(fVar239 * auVar50._0_4_)),
                                                    ZEXT416((uint)fVar237),auVar49);
                          auVar47 = vfmadd231ss_fma(auVar47,ZEXT416((uint)fVar226),auVar48);
                          auVar57 = vfmadd231ss_fma(auVar47,ZEXT416((uint)fVar242),auVar57);
                          fVar238 = auVar57._0_4_;
                          if ((fVar103 <= fVar238) &&
                             (fVar240 = *(float *)(ray + k * 4 + 0x100), fVar238 <= fVar240)) {
                            auVar57 = vshufps_avx(auVar43,auVar43,0x55);
                            auVar214._8_4_ = 0x3f800000;
                            auVar214._0_8_ = &DAT_3f8000003f800000;
                            auVar214._12_4_ = 0x3f800000;
                            auVar47 = vsubps_avx(auVar214,auVar57);
                            fVar241 = auVar57._0_4_;
                            auVar222._0_4_ = fVar241 * (float)local_360._0_4_;
                            fVar201 = auVar57._4_4_;
                            auVar222._4_4_ = fVar201 * (float)local_360._4_4_;
                            fVar202 = auVar57._8_4_;
                            auVar222._8_4_ = fVar202 * fStack_358;
                            fVar203 = auVar57._12_4_;
                            auVar222._12_4_ = fVar203 * fStack_354;
                            auVar235._0_4_ = fVar241 * (float)local_370._0_4_;
                            auVar235._4_4_ = fVar201 * (float)local_370._4_4_;
                            auVar235._8_4_ = fVar202 * fStack_368;
                            auVar235._12_4_ = fVar203 * fStack_364;
                            auVar248._0_4_ = fVar241 * (float)local_380._0_4_;
                            auVar248._4_4_ = fVar201 * (float)local_380._4_4_;
                            auVar248._8_4_ = fVar202 * fStack_378;
                            auVar248._12_4_ = fVar203 * fStack_374;
                            auVar198._0_4_ = fVar241 * (float)local_390._0_4_;
                            auVar198._4_4_ = fVar201 * (float)local_390._4_4_;
                            auVar198._8_4_ = fVar202 * fStack_388;
                            auVar198._12_4_ = fVar203 * fStack_384;
                            auVar57 = vfmadd231ps_fma(auVar222,auVar47,local_320);
                            auVar48 = vfmadd231ps_fma(auVar235,auVar47,local_330);
                            auVar49 = vfmadd231ps_fma(auVar248,auVar47,local_340);
                            auVar50 = vfmadd231ps_fma(auVar198,auVar47,local_350);
                            auVar57 = vsubps_avx(auVar48,auVar57);
                            auVar47 = vsubps_avx(auVar49,auVar48);
                            auVar48 = vsubps_avx(auVar50,auVar49);
                            auVar249._0_4_ = local_120 * auVar47._0_4_;
                            auVar249._4_4_ = local_120 * auVar47._4_4_;
                            auVar249._8_4_ = local_120 * auVar47._8_4_;
                            auVar249._12_4_ = local_120 * auVar47._12_4_;
                            auVar185._4_4_ = auVar185._0_4_;
                            auVar185._8_4_ = auVar185._0_4_;
                            auVar185._12_4_ = auVar185._0_4_;
                            auVar57 = vfmadd231ps_fma(auVar249,auVar185,auVar57);
                            auVar199._0_4_ = local_120 * auVar48._0_4_;
                            auVar199._4_4_ = local_120 * auVar48._4_4_;
                            auVar199._8_4_ = local_120 * auVar48._8_4_;
                            auVar199._12_4_ = local_120 * auVar48._12_4_;
                            auVar47 = vfmadd231ps_fma(auVar199,auVar185,auVar47);
                            auVar200._0_4_ = local_120 * auVar47._0_4_;
                            auVar200._4_4_ = local_120 * auVar47._4_4_;
                            auVar200._8_4_ = local_120 * auVar47._8_4_;
                            auVar200._12_4_ = local_120 * auVar47._12_4_;
                            auVar57 = vfmadd231ps_fma(auVar200,auVar185,auVar57);
                            auVar57 = vmulps_avx512vl(auVar57,auVar59);
                            pGVar7 = (context->scene->geometries).items[uVar39].ptr;
                            if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                              bVar41 = false;
                            }
                            else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                    (bVar41 = true,
                                    pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                              auVar174._0_4_ = fVar239 * (float)local_3e0._0_4_;
                              auVar174._4_4_ = fVar239 * (float)local_3e0._4_4_;
                              auVar174._8_4_ = fVar239 * fStack_3d8;
                              auVar174._12_4_ = fVar239 * fStack_3d4;
                              auVar155._4_4_ = fVar237;
                              auVar155._0_4_ = fVar237;
                              auVar155._8_4_ = fVar237;
                              auVar155._12_4_ = fVar237;
                              auVar59 = vfmadd132ps_fma(auVar155,auVar174,local_3d0);
                              auVar142._4_4_ = fVar226;
                              auVar142._0_4_ = fVar226;
                              auVar142._8_4_ = fVar226;
                              auVar142._12_4_ = fVar226;
                              auVar59 = vfmadd132ps_fma(auVar142,auVar59,local_3c0);
                              auVar126._4_4_ = fVar242;
                              auVar126._0_4_ = fVar242;
                              auVar126._8_4_ = fVar242;
                              auVar126._12_4_ = fVar242;
                              auVar48 = vfmadd132ps_fma(auVar126,auVar59,local_3b0);
                              auVar59 = vshufps_avx(auVar48,auVar48,0xc9);
                              auVar47 = vshufps_avx(auVar57,auVar57,0xc9);
                              auVar127._0_4_ = auVar48._0_4_ * auVar47._0_4_;
                              auVar127._4_4_ = auVar48._4_4_ * auVar47._4_4_;
                              auVar127._8_4_ = auVar48._8_4_ * auVar47._8_4_;
                              auVar127._12_4_ = auVar48._12_4_ * auVar47._12_4_;
                              auVar57 = vfmsub231ps_fma(auVar127,auVar57,auVar59);
                              auVar158._8_4_ = 1;
                              auVar158._0_8_ = 0x100000001;
                              auVar158._12_4_ = 1;
                              auVar158._16_4_ = 1;
                              auVar158._20_4_ = 1;
                              auVar158._24_4_ = 1;
                              auVar158._28_4_ = 1;
                              local_100 = vpermps_avx2(auVar158,ZEXT1632(auVar43));
                              auVar88 = vpermps_avx2(auVar158,ZEXT1632(auVar57));
                              auVar175._8_4_ = 2;
                              auVar175._0_8_ = 0x200000002;
                              auVar175._12_4_ = 2;
                              auVar175._16_4_ = 2;
                              auVar175._20_4_ = 2;
                              auVar175._24_4_ = 2;
                              auVar175._28_4_ = 2;
                              local_160 = vpermps_avx2(auVar175,ZEXT1632(auVar57));
                              local_140 = auVar57._0_4_;
                              local_180[0] = (RTCHitN)auVar88[0];
                              local_180[1] = (RTCHitN)auVar88[1];
                              local_180[2] = (RTCHitN)auVar88[2];
                              local_180[3] = (RTCHitN)auVar88[3];
                              local_180[4] = (RTCHitN)auVar88[4];
                              local_180[5] = (RTCHitN)auVar88[5];
                              local_180[6] = (RTCHitN)auVar88[6];
                              local_180[7] = (RTCHitN)auVar88[7];
                              local_180[8] = (RTCHitN)auVar88[8];
                              local_180[9] = (RTCHitN)auVar88[9];
                              local_180[10] = (RTCHitN)auVar88[10];
                              local_180[0xb] = (RTCHitN)auVar88[0xb];
                              local_180[0xc] = (RTCHitN)auVar88[0xc];
                              local_180[0xd] = (RTCHitN)auVar88[0xd];
                              local_180[0xe] = (RTCHitN)auVar88[0xe];
                              local_180[0xf] = (RTCHitN)auVar88[0xf];
                              local_180[0x10] = (RTCHitN)auVar88[0x10];
                              local_180[0x11] = (RTCHitN)auVar88[0x11];
                              local_180[0x12] = (RTCHitN)auVar88[0x12];
                              local_180[0x13] = (RTCHitN)auVar88[0x13];
                              local_180[0x14] = (RTCHitN)auVar88[0x14];
                              local_180[0x15] = (RTCHitN)auVar88[0x15];
                              local_180[0x16] = (RTCHitN)auVar88[0x16];
                              local_180[0x17] = (RTCHitN)auVar88[0x17];
                              local_180[0x18] = (RTCHitN)auVar88[0x18];
                              local_180[0x19] = (RTCHitN)auVar88[0x19];
                              local_180[0x1a] = (RTCHitN)auVar88[0x1a];
                              local_180[0x1b] = (RTCHitN)auVar88[0x1b];
                              local_180[0x1c] = (RTCHitN)auVar88[0x1c];
                              local_180[0x1d] = (RTCHitN)auVar88[0x1d];
                              local_180[0x1e] = (RTCHitN)auVar88[0x1e];
                              local_180[0x1f] = (RTCHitN)auVar88[0x1f];
                              uStack_13c = local_140;
                              uStack_138 = local_140;
                              uStack_134 = local_140;
                              uStack_130 = local_140;
                              uStack_12c = local_140;
                              uStack_128 = local_140;
                              uStack_124 = local_140;
                              fStack_11c = local_120;
                              fStack_118 = local_120;
                              fStack_114 = local_120;
                              fStack_110 = local_120;
                              fStack_10c = local_120;
                              fStack_108 = local_120;
                              fStack_104 = local_120;
                              local_e0 = local_200._0_8_;
                              uStack_d8 = local_200._8_8_;
                              uStack_d0 = local_200._16_8_;
                              uStack_c8 = local_200._24_8_;
                              local_c0 = local_220;
                              vpcmpeqd_avx2(local_220,local_220);
                              uStack_9c = context->user->instID[0];
                              local_a0 = uStack_9c;
                              uStack_98 = uStack_9c;
                              uStack_94 = uStack_9c;
                              uStack_90 = uStack_9c;
                              uStack_8c = uStack_9c;
                              uStack_88 = uStack_9c;
                              uStack_84 = uStack_9c;
                              uStack_7c = context->user->instPrimID[0];
                              local_80 = uStack_7c;
                              uStack_78 = uStack_7c;
                              uStack_74 = uStack_7c;
                              uStack_70 = uStack_7c;
                              uStack_6c = uStack_7c;
                              uStack_68 = uStack_7c;
                              uStack_64 = uStack_7c;
                              *(float *)(ray + k * 4 + 0x100) = fVar238;
                              local_400 = local_240._0_8_;
                              uStack_3f8 = local_240._8_8_;
                              uStack_3f0 = local_240._16_8_;
                              uStack_3e8 = local_240._24_8_;
                              local_430.valid = (int *)&local_400;
                              local_430.geometryUserPtr = pGVar7->userPtr;
                              local_430.context = context->user;
                              local_430.ray = (RTCRayN *)ray;
                              local_430.hit = local_180;
                              local_430.N = 8;
                              if (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                (*pGVar7->occlusionFilterN)(&local_430);
                                in_ZMM22 = ZEXT464(0x38d1b717);
                                auVar88 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                in_ZMM17 = ZEXT3264(auVar88);
                                auVar279 = ZEXT464(0x3f800000);
                                auVar43 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                auVar277 = ZEXT1664(auVar43);
                                auVar43 = vxorps_avx512vl(auVar60,auVar60);
                                auVar282 = ZEXT1664(auVar43);
                                auVar43 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                auVar278 = ZEXT1664(auVar43);
                              }
                              auVar43 = auVar282._0_16_;
                              auVar28._8_8_ = uStack_3f8;
                              auVar28._0_8_ = local_400;
                              auVar28._16_8_ = uStack_3f0;
                              auVar28._24_8_ = uStack_3e8;
                              if (auVar28 == (undefined1  [32])0x0) {
                                bVar41 = false;
                              }
                              else {
                                p_Var12 = context->args->filter;
                                if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                                   (((context->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                    (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                                  (*p_Var12)(&local_430);
                                  in_ZMM22 = ZEXT464(0x38d1b717);
                                  auVar88 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                  in_ZMM17 = ZEXT3264(auVar88);
                                  auVar279 = ZEXT464(0x3f800000);
                                  auVar57 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                  auVar277 = ZEXT1664(auVar57);
                                  auVar43 = vxorps_avx512vl(auVar43,auVar43);
                                  auVar282 = ZEXT1664(auVar43);
                                  auVar43 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                  auVar278 = ZEXT1664(auVar43);
                                }
                                auVar29._8_8_ = uStack_3f8;
                                auVar29._0_8_ = local_400;
                                auVar29._16_8_ = uStack_3f0;
                                auVar29._24_8_ = uStack_3e8;
                                uVar35 = vptestmd_avx512vl(auVar29,auVar29);
                                auVar88 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                bVar41 = (bool)((byte)uVar35 & 1);
                                bVar13 = (bool)((byte)(uVar35 >> 1) & 1);
                                bVar14 = (bool)((byte)(uVar35 >> 2) & 1);
                                bVar15 = (bool)((byte)(uVar35 >> 3) & 1);
                                bVar16 = (bool)((byte)(uVar35 >> 4) & 1);
                                bVar17 = (bool)((byte)(uVar35 >> 5) & 1);
                                bVar18 = (bool)((byte)(uVar35 >> 6) & 1);
                                bVar19 = SUB81(uVar35 >> 7,0);
                                *(uint *)(local_430.ray + 0x100) =
                                     (uint)bVar41 * auVar88._0_4_ |
                                     (uint)!bVar41 * *(int *)(local_430.ray + 0x100);
                                *(uint *)(local_430.ray + 0x104) =
                                     (uint)bVar13 * auVar88._4_4_ |
                                     (uint)!bVar13 * *(int *)(local_430.ray + 0x104);
                                *(uint *)(local_430.ray + 0x108) =
                                     (uint)bVar14 * auVar88._8_4_ |
                                     (uint)!bVar14 * *(int *)(local_430.ray + 0x108);
                                *(uint *)(local_430.ray + 0x10c) =
                                     (uint)bVar15 * auVar88._12_4_ |
                                     (uint)!bVar15 * *(int *)(local_430.ray + 0x10c);
                                *(uint *)(local_430.ray + 0x110) =
                                     (uint)bVar16 * auVar88._16_4_ |
                                     (uint)!bVar16 * *(int *)(local_430.ray + 0x110);
                                *(uint *)(local_430.ray + 0x114) =
                                     (uint)bVar17 * auVar88._20_4_ |
                                     (uint)!bVar17 * *(int *)(local_430.ray + 0x114);
                                *(uint *)(local_430.ray + 0x118) =
                                     (uint)bVar18 * auVar88._24_4_ |
                                     (uint)!bVar18 * *(int *)(local_430.ray + 0x118);
                                *(uint *)(local_430.ray + 0x11c) =
                                     (uint)bVar19 * auVar88._28_4_ |
                                     (uint)!bVar19 * *(int *)(local_430.ray + 0x11c);
                                bVar41 = auVar29 != (undefined1  [32])0x0;
                              }
                              if (!bVar41) {
                                *(float *)(ray + k * 4 + 0x100) = fVar240;
                              }
                            }
                            auVar276 = ZEXT1664(auVar46);
                            bVar40 = (bool)(bVar40 | bVar41);
                          }
                        }
                      }
                    }
                  }
                  break;
                }
                lVar36 = lVar36 + -1;
              } while (lVar36 != 0);
            }
          }
        }
      }
    } while (bVar22);
    auVar43 = vinsertps_avx512f(auVar45,auVar61,0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }